

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx::SubGridMBIntersectorKPluecker<4,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  long lVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  size_t k;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  byte bVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  byte bVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  uint uVar67;
  undefined4 uVar68;
  int iVar69;
  uint uVar70;
  AABBNodeMB4D *node1;
  ulong uVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  ulong uVar76;
  Geometry *pGVar77;
  NodeRef root;
  ulong uVar78;
  ulong *puVar79;
  undefined1 (*pauVar80) [16];
  ulong uVar81;
  RayK<4> *pRVar82;
  RayQueryContext *pRVar83;
  long lVar84;
  bool bVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  float fVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar126;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar124;
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [64];
  vint4 ai_2;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar152;
  float fVar153;
  vint4 bi_1;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar154;
  float fVar158;
  float fVar159;
  undefined1 auVar151 [32];
  vint4 bi_3;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar174;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  vint4 bi;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar187;
  float fVar188;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  vint4 bi_2;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar193 [32];
  float fVar206;
  float fVar213;
  float fVar214;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 auVar210 [32];
  float fVar215;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar219;
  float fVar220;
  float fVar225;
  float fVar226;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar228;
  float fVar229;
  float fVar230;
  undefined1 auVar223 [32];
  float fVar227;
  float fVar231;
  undefined1 auVar224 [32];
  float fVar232;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar233 [32];
  undefined1 auVar240 [32];
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar244 [32];
  vint4 ai;
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [64];
  float fVar266;
  float fVar269;
  float fVar270;
  vint4 ai_1;
  undefined1 auVar267 [16];
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  undefined1 auVar268 [32];
  float fVar275;
  float fVar276;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  vint4 ai_3;
  undefined1 auVar277 [16];
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  Precalculations pre;
  UVIdentity<8> mapUV;
  vbool<4> terminated;
  float old_t;
  vbool<4> valid0;
  RTCFilterFunctionNArguments args;
  TravRayK<4,_true> tray;
  vint<4> itime;
  vfloat<4> ftime;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  Precalculations local_1dea;
  undefined1 local_1de9;
  undefined1 (*local_1de8) [16];
  ulong *local_1de0;
  RayK<4> *local_1dd8;
  uint local_1dcc;
  uint local_1dc8;
  uint local_1dc4;
  undefined1 local_1dc0 [16];
  ulong local_1db0;
  RayK<4> *local_1da8;
  undefined1 local_1da0 [32];
  undefined1 local_1d80 [32];
  undefined1 local_1d60 [48];
  undefined1 local_1d30 [16];
  undefined1 local_1d20 [16];
  BVH *local_1d08;
  Intersectors *local_1d00;
  long local_1cf8;
  long local_1cf0;
  long local_1ce8;
  ulong local_1ce0;
  RayQueryContext *local_1cd8;
  ulong local_1cd0;
  ulong local_1cc8;
  long local_1cc0;
  long local_1cb8;
  Scene *local_1cb0;
  long local_1ca8;
  undefined1 local_1ca0 [32];
  undefined1 local_1c80 [8];
  float fStack_1c78;
  float fStack_1c74;
  float fStack_1c70;
  float fStack_1c6c;
  float fStack_1c68;
  float fStack_1c64;
  undefined1 local_1c50 [16];
  RTCFilterFunctionNArguments local_1c40;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_1c10;
  undefined1 local_1be0 [16];
  undefined1 local_1bd0 [16];
  undefined1 local_1bc0 [16];
  undefined1 local_1bb0 [16];
  undefined1 local_1ba0 [8];
  float fStack_1b98;
  float fStack_1b94;
  undefined1 local_1b90 [8];
  float fStack_1b88;
  float fStack_1b84;
  undefined1 local_1b80 [16];
  undefined1 local_1b70 [16];
  undefined1 local_1b60 [16];
  undefined1 local_1b50 [16];
  undefined1 local_1b40 [16];
  float local_1b30 [4];
  undefined1 local_1b20 [16];
  undefined1 local_1b10 [16];
  undefined4 local_1b00;
  undefined4 uStack_1afc;
  undefined4 uStack_1af8;
  undefined4 uStack_1af4;
  undefined1 local_1af0 [16];
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined1 local_1ad0 [16];
  uint local_1ac0;
  uint uStack_1abc;
  uint uStack_1ab8;
  uint uStack_1ab4;
  uint uStack_1ab0;
  uint uStack_1aac;
  uint uStack_1aa8;
  uint uStack_1aa4;
  undefined1 local_1aa0 [32];
  undefined1 local_1a70 [16];
  undefined1 local_1a60 [16];
  undefined1 local_1a50 [16];
  undefined1 local_1a40 [16];
  undefined1 local_1a30 [16];
  undefined1 local_1a20 [16];
  undefined1 local_1a10 [16];
  float local_1a00 [4];
  float fStack_19f0;
  float fStack_19ec;
  float fStack_19e8;
  float fStack_19e4;
  undefined1 local_19e0 [32];
  undefined1 local_19c0 [32];
  undefined1 *local_19a0;
  undefined1 local_1980 [32];
  undefined1 local_1960 [32];
  undefined1 local_1940 [32];
  undefined1 local_1920 [32];
  float local_1900 [4];
  float fStack_18f0;
  float fStack_18ec;
  float fStack_18e8;
  undefined4 uStack_18e4;
  float local_18e0 [4];
  float fStack_18d0;
  float fStack_18cc;
  float fStack_18c8;
  undefined4 uStack_18c4;
  float local_18c0 [4];
  float fStack_18b0;
  float fStack_18ac;
  float fStack_18a8;
  undefined4 uStack_18a4;
  undefined1 local_18a0 [8];
  float fStack_1898;
  float fStack_1894;
  float fStack_1890;
  float fStack_188c;
  float fStack_1888;
  undefined1 local_1880 [32];
  undefined1 local_1860 [32];
  undefined1 local_1840 [8];
  float fStack_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  float fStack_1828;
  undefined1 local_1820 [8];
  float fStack_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float fStack_1808;
  undefined1 local_1800 [32];
  undefined1 local_17e0 [32];
  undefined1 local_17c0 [32];
  undefined1 local_17a0 [32];
  undefined1 local_1780 [32];
  undefined1 local_1760 [32];
  undefined1 local_1740 [32];
  undefined1 local_1720 [32];
  undefined8 local_1700;
  size_t local_16f8;
  ulong local_16f0 [240];
  undefined4 local_f70;
  undefined4 uStack_f6c;
  undefined4 uStack_f68;
  undefined4 uStack_f64;
  undefined1 local_f60 [16];
  undefined1 local_f50 [3872];
  
  local_1d08 = (BVH *)This->ptr;
  local_16f8 = (local_1d08->root).ptr;
  if (local_16f8 != 8) {
    auVar113 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar139 = vpcmpeqd_avx(auVar113,(undefined1  [16])valid_i->field_0);
    auVar101 = ZEXT816(0) << 0x40;
    auVar87 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar101,5);
    auVar100 = auVar139 & auVar87;
    if ((((auVar100 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar100 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar100 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar100[0xf] < '\0'
       ) {
      local_1a70 = vandps_avx(auVar87,auVar139);
      local_1c10._0_8_ = *(undefined8 *)ray;
      local_1c10._8_8_ = *(undefined8 *)(ray + 8);
      local_1c10._16_8_ = *(undefined8 *)(ray + 0x10);
      local_1c10._24_8_ = *(undefined8 *)(ray + 0x18);
      local_1c10._32_8_ = *(undefined8 *)(ray + 0x20);
      local_1c10._40_8_ = *(undefined8 *)(ray + 0x28);
      local_1be0 = *(undefined1 (*) [16])(ray + 0x40);
      local_1bd0 = *(undefined1 (*) [16])(ray + 0x50);
      local_1bc0 = *(undefined1 (*) [16])(ray + 0x60);
      auVar175._8_4_ = 0x7fffffff;
      auVar175._0_8_ = 0x7fffffff7fffffff;
      auVar175._12_4_ = 0x7fffffff;
      auVar87 = vandps_avx(local_1be0,auVar175);
      auVar207._8_4_ = 0x219392ef;
      auVar207._0_8_ = 0x219392ef219392ef;
      auVar207._12_4_ = 0x219392ef;
      auVar139 = vcmpps_avx(auVar87,auVar207,1);
      auVar221._8_4_ = 0x3f800000;
      auVar221._0_8_ = 0x3f8000003f800000;
      auVar221._12_4_ = 0x3f800000;
      auVar140 = vdivps_avx(auVar221,local_1be0);
      auVar87 = vandps_avx(local_1bd0,auVar175);
      auVar100 = vcmpps_avx(auVar87,auVar207,1);
      auVar160 = vdivps_avx(auVar221,local_1bd0);
      auVar87 = vandps_avx(local_1bc0,auVar175);
      auVar87 = vcmpps_avx(auVar87,auVar207,1);
      auVar175 = vdivps_avx(auVar221,local_1bc0);
      auVar208._8_4_ = 0x5d5e0b6b;
      auVar208._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar208._12_4_ = 0x5d5e0b6b;
      local_1bb0 = vblendvps_avx(auVar140,auVar208,auVar139);
      _local_1ba0 = vblendvps_avx(auVar160,auVar208,auVar100);
      _local_1b90 = vblendvps_avx(auVar175,auVar208,auVar87);
      auVar87 = vcmpps_avx(local_1bb0,auVar101,1);
      auVar176._8_4_ = 0x10;
      auVar176._0_8_ = 0x1000000010;
      auVar176._12_4_ = 0x10;
      local_1b80 = vandps_avx(auVar87,auVar176);
      auVar87 = vcmpps_avx(_local_1ba0,auVar101,5);
      auVar139._8_4_ = 0x20;
      auVar139._0_8_ = 0x2000000020;
      auVar139._12_4_ = 0x20;
      auVar177._8_4_ = 0x30;
      auVar177._0_8_ = 0x3000000030;
      auVar177._12_4_ = 0x30;
      local_1b70 = vblendvps_avx(auVar177,auVar139,auVar87);
      auVar87 = vcmpps_avx(_local_1b90,auVar101,5);
      auVar140._8_4_ = 0x40;
      auVar140._0_8_ = 0x4000000040;
      auVar140._12_4_ = 0x40;
      auVar160._8_4_ = 0x50;
      auVar160._0_8_ = 0x5000000050;
      auVar160._12_4_ = 0x50;
      local_1b60 = vblendvps_avx(auVar160,auVar140,auVar87);
      auVar87 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar101);
      auVar139 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar101);
      auVar100._8_4_ = 0x7f800000;
      auVar100._0_8_ = 0x7f8000007f800000;
      auVar100._12_4_ = 0x7f800000;
      local_1b50 = vblendvps_avx(auVar100,auVar87,local_1a70);
      auVar87._8_4_ = 0xff800000;
      auVar87._0_8_ = 0xff800000ff800000;
      auVar87._12_4_ = 0xff800000;
      local_1b40 = vblendvps_avx(auVar87,auVar139,local_1a70);
      local_1dc0._4_4_ = local_1a70._4_4_ ^ auVar113._4_4_;
      local_1dc0._0_4_ = local_1a70._0_4_ ^ auVar113._0_4_;
      local_1dc0._8_4_ = local_1a70._8_4_ ^ auVar113._8_4_;
      local_1dc0._12_4_ = local_1a70._12_4_ ^ auVar113._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        local_1db0 = 3;
      }
      else {
        local_1db0 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                            RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1da8 = ray + 0x80;
      local_1700 = 0xfffffffffffffff8;
      local_f70 = 0x7f800000;
      uStack_f6c = 0x7f800000;
      uStack_f68 = 0x7f800000;
      uStack_f64 = 0x7f800000;
      local_f60 = local_1b50;
      auVar87 = mm_lookupmask_ps._0_16_;
      local_1880._16_16_ = mm_lookupmask_ps._240_16_;
      local_1880._0_16_ = auVar87;
      bVar61 = (byte)local_1db0;
      auVar121._8_4_ = 0x3f800000;
      auVar121._0_8_ = 0x3f8000003f800000;
      auVar121._12_4_ = 0x3f800000;
      auVar121._16_4_ = 0x3f800000;
      auVar121._20_4_ = 0x3f800000;
      auVar121._24_4_ = 0x3f800000;
      auVar121._28_4_ = 0x3f800000;
      auVar96._8_4_ = 0xbf800000;
      auVar96._0_8_ = 0xbf800000bf800000;
      auVar96._12_4_ = 0xbf800000;
      auVar96._16_4_ = 0xbf800000;
      auVar96._20_4_ = 0xbf800000;
      auVar96._24_4_ = 0xbf800000;
      auVar96._28_4_ = 0xbf800000;
      _local_18a0 = vblendvps_avx(auVar121,auVar96,local_1880);
      auVar87 = vpcmpeqd_avx(auVar87,auVar87);
      auVar111 = ZEXT1664(auVar87);
      puVar79 = local_16f0;
      pauVar80 = (undefined1 (*) [16])local_f50;
      local_1dd8 = ray;
      local_1d00 = This;
      local_1cd8 = context;
LAB_0030a17e:
      do {
        do {
          root.ptr = puVar79[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0030b741;
          local_1de0 = puVar79 + -1;
          local_1de8 = pauVar80 + -1;
          auVar87 = *local_1de8;
          auVar123 = ZEXT1664(auVar87);
          auVar113 = vcmpps_avx(auVar87,local_1b40,1);
          uVar67 = vmovmskps_avx(auVar113);
          puVar79 = local_1de0;
          pauVar80 = local_1de8;
        } while (uVar67 == 0);
        uVar78 = (ulong)(uVar67 & 0xff);
        uVar71 = (ulong)(uint)POPCOUNT(uVar67 & 0xff);
        if (local_1db0 < uVar71) {
LAB_0030a1bf:
          do {
            lVar74 = -0x10;
            uVar67 = (uint)root.ptr;
            auVar87 = auVar123._0_16_;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0030b741;
              auVar113 = vcmpps_avx(local_1b40,auVar87,6);
              if ((((auVar113 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar113 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar113 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar113[0xf] < '\0') {
                local_1cf8 = (ulong)(uVar67 & 0xf) - 8;
                if (local_1cf8 == 0) {
                  auVar87 = vpcmpeqd_avx(auVar87,auVar87);
                  auVar108 = local_1dc0;
                }
                else {
                  uVar78 = root.ptr & 0xfffffffffffffff0;
                  auVar111 = ZEXT1664(CONCAT412(local_1dc0._12_4_ ^ auVar111._12_4_,
                                                CONCAT48(local_1dc0._8_4_ ^ auVar111._8_4_,
                                                         CONCAT44(local_1dc0._4_4_ ^ auVar111._4_4_,
                                                                  local_1dc0._0_4_ ^ auVar111._0_4_)
                                                        )));
                  lVar74 = 0;
                  local_1de8 = pauVar80;
                  local_1de0 = puVar79;
                  do {
                    lVar72 = lVar74 * 0x90;
                    auVar86._8_8_ = 0;
                    auVar86._0_8_ = *(ulong *)(uVar78 + 0x20 + lVar72);
                    auVar102._8_8_ = 0;
                    auVar102._0_8_ = *(ulong *)(uVar78 + 0x24 + lVar72);
                    auVar113 = vpminub_avx(auVar86,auVar102);
                    auVar87 = vpcmpeqb_avx(auVar86,auVar113);
                    auVar113 = vpcmpeqd_avx(auVar113,auVar113);
                    auVar87 = vpmovzxbd_avx(auVar87 ^ auVar113);
                    auVar87 = vpslld_avx(auVar87 ^ auVar113,0x1f);
                    uVar67 = vmovmskps_avx(auVar87);
                    local_1cf0 = lVar74;
                    if (uVar67 != 0) {
                      lVar74 = uVar78 + lVar72;
                      uVar68 = *(undefined4 *)(uVar78 + 0x80 + lVar72);
                      auVar88._4_4_ = uVar68;
                      auVar88._0_4_ = uVar68;
                      auVar88._8_4_ = uVar68;
                      auVar88._12_4_ = uVar68;
                      auVar87 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar88);
                      fVar187 = *(float *)(uVar78 + 0x84 + lVar72);
                      local_1a60._0_4_ = fVar187 * auVar87._0_4_;
                      local_1a60._4_4_ = fVar187 * auVar87._4_4_;
                      local_1a60._8_4_ = fVar187 * auVar87._8_4_;
                      local_1a60._12_4_ = fVar187 * auVar87._12_4_;
                      auVar265 = ZEXT1664(local_1a60);
                      uVar71 = (ulong)(uVar67 & 0xff);
                      local_1ce8 = lVar74;
                      do {
                        auVar87 = auVar111._0_16_;
                        lVar72 = 0;
                        if (uVar71 != 0) {
                          for (; (uVar71 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
                          }
                        }
                        auVar89._8_8_ = 0;
                        auVar89._0_8_ = *(ulong *)(lVar74 + 0x20);
                        auVar113 = vpmovzxbd_avx(auVar89);
                        auVar113 = vcvtdq2ps_avx(auVar113);
                        fVar187 = *(float *)(lVar74 + 0x44);
                        fVar194 = *(float *)(lVar74 + 0x38);
                        local_1a00[0] = fVar194 + fVar187 * auVar113._0_4_;
                        local_1a00[1] = fVar194 + fVar187 * auVar113._4_4_;
                        local_1a00[2] = fVar194 + fVar187 * auVar113._8_4_;
                        local_1a00[3] = fVar194 + fVar187 * auVar113._12_4_;
                        fVar125 = local_1a00[lVar72];
                        auVar132._8_8_ = 0;
                        auVar132._0_8_ = *(ulong *)(lVar74 + 0x50);
                        auVar113 = vpmovzxbd_avx(auVar132);
                        auVar113 = vcvtdq2ps_avx(auVar113);
                        fVar126 = *(float *)(lVar74 + 0x74);
                        fVar127 = *(float *)(lVar74 + 0x68);
                        local_1b30[0] = fVar127 + fVar126 * auVar113._0_4_;
                        local_1b30[1] = fVar127 + fVar126 * auVar113._4_4_;
                        local_1b30[2] = fVar127 + fVar126 * auVar113._8_4_;
                        local_1b30[3] = fVar127 + fVar126 * auVar113._12_4_;
                        auVar113 = vshufps_avx(ZEXT416((uint)(local_1b30[lVar72] - fVar125)),
                                               ZEXT416((uint)(local_1b30[lVar72] - fVar125)),0);
                        fVar128 = auVar265._0_4_;
                        fVar129 = auVar265._4_4_;
                        fVar152 = auVar265._8_4_;
                        fVar153 = auVar265._12_4_;
                        auVar90._0_4_ = fVar125 + fVar128 * auVar113._0_4_;
                        auVar90._4_4_ = fVar125 + fVar129 * auVar113._4_4_;
                        auVar90._8_4_ = fVar125 + fVar152 * auVar113._8_4_;
                        auVar90._12_4_ = fVar125 + fVar153 * auVar113._12_4_;
                        auVar133._8_8_ = 0;
                        auVar133._0_8_ = *(ulong *)(lVar74 + 0x24);
                        auVar113 = vpmovzxbd_avx(auVar133);
                        auVar113 = vcvtdq2ps_avx(auVar113);
                        local_1a00[0] = fVar194 + fVar187 * auVar113._0_4_;
                        local_1a00[1] = fVar194 + fVar187 * auVar113._4_4_;
                        local_1a00[2] = fVar194 + fVar187 * auVar113._8_4_;
                        local_1a00[3] = fVar194 + fVar187 * auVar113._12_4_;
                        fVar187 = local_1a00[lVar72];
                        auVar114._8_8_ = 0;
                        auVar114._0_8_ = *(ulong *)(lVar74 + 0x54);
                        auVar113 = vpmovzxbd_avx(auVar114);
                        auVar113 = vcvtdq2ps_avx(auVar113);
                        local_1b30[0] = fVar127 + fVar126 * auVar113._0_4_;
                        local_1b30[1] = fVar127 + fVar126 * auVar113._4_4_;
                        local_1b30[2] = fVar127 + fVar126 * auVar113._8_4_;
                        local_1b30[3] = fVar127 + fVar126 * auVar113._12_4_;
                        auVar113 = vshufps_avx(ZEXT416((uint)(local_1b30[lVar72] - fVar187)),
                                               ZEXT416((uint)(local_1b30[lVar72] - fVar187)),0);
                        auVar103._0_4_ = fVar187 + fVar128 * auVar113._0_4_;
                        auVar103._4_4_ = fVar187 + fVar129 * auVar113._4_4_;
                        auVar103._8_4_ = fVar187 + fVar152 * auVar113._8_4_;
                        auVar103._12_4_ = fVar187 + fVar153 * auVar113._12_4_;
                        auVar115._8_8_ = 0;
                        auVar115._0_8_ = *(ulong *)(lVar74 + 0x28);
                        auVar113 = vpmovzxbd_avx(auVar115);
                        auVar113 = vcvtdq2ps_avx(auVar113);
                        fVar187 = *(float *)(lVar74 + 0x48);
                        fVar194 = *(float *)(lVar74 + 0x3c);
                        local_1a00[0] = fVar194 + fVar187 * auVar113._0_4_;
                        local_1a00[1] = fVar194 + fVar187 * auVar113._4_4_;
                        local_1a00[2] = fVar194 + fVar187 * auVar113._8_4_;
                        local_1a00[3] = fVar194 + fVar187 * auVar113._12_4_;
                        fVar125 = local_1a00[lVar72];
                        auVar165._8_8_ = 0;
                        auVar165._0_8_ = *(ulong *)(lVar74 + 0x58);
                        auVar113 = vpmovzxbd_avx(auVar165);
                        auVar113 = vcvtdq2ps_avx(auVar113);
                        fVar126 = *(float *)(lVar74 + 0x78);
                        fVar127 = *(float *)(lVar74 + 0x6c);
                        local_1b30[0] = fVar127 + fVar126 * auVar113._0_4_;
                        local_1b30[1] = fVar127 + fVar126 * auVar113._4_4_;
                        local_1b30[2] = fVar127 + fVar126 * auVar113._8_4_;
                        local_1b30[3] = fVar127 + fVar126 * auVar113._12_4_;
                        auVar113 = vshufps_avx(ZEXT416((uint)(local_1b30[lVar72] - fVar125)),
                                               ZEXT416((uint)(local_1b30[lVar72] - fVar125)),0);
                        auVar116._0_4_ = fVar125 + fVar128 * auVar113._0_4_;
                        auVar116._4_4_ = fVar125 + fVar129 * auVar113._4_4_;
                        auVar116._8_4_ = fVar125 + fVar152 * auVar113._8_4_;
                        auVar116._12_4_ = fVar125 + fVar153 * auVar113._12_4_;
                        auVar166._8_8_ = 0;
                        auVar166._0_8_ = *(ulong *)(lVar74 + 0x2c);
                        auVar113 = vpmovzxbd_avx(auVar166);
                        auVar113 = vcvtdq2ps_avx(auVar113);
                        local_1a00[0] = fVar194 + fVar187 * auVar113._0_4_;
                        local_1a00[1] = fVar194 + fVar187 * auVar113._4_4_;
                        local_1a00[2] = fVar194 + fVar187 * auVar113._8_4_;
                        local_1a00[3] = fVar194 + fVar187 * auVar113._12_4_;
                        fVar187 = local_1a00[lVar72];
                        auVar144._8_8_ = 0;
                        auVar144._0_8_ = *(ulong *)(lVar74 + 0x5c);
                        auVar113 = vpmovzxbd_avx(auVar144);
                        auVar113 = vcvtdq2ps_avx(auVar113);
                        local_1b30[0] = fVar127 + fVar126 * auVar113._0_4_;
                        local_1b30[1] = fVar127 + fVar126 * auVar113._4_4_;
                        local_1b30[2] = fVar127 + fVar126 * auVar113._8_4_;
                        local_1b30[3] = fVar127 + fVar126 * auVar113._12_4_;
                        auVar113 = vshufps_avx(ZEXT416((uint)(local_1b30[lVar72] - fVar187)),
                                               ZEXT416((uint)(local_1b30[lVar72] - fVar187)),0);
                        auVar134._0_4_ = fVar187 + fVar128 * auVar113._0_4_;
                        auVar134._4_4_ = fVar187 + fVar129 * auVar113._4_4_;
                        auVar134._8_4_ = fVar187 + fVar152 * auVar113._8_4_;
                        auVar134._12_4_ = fVar187 + fVar153 * auVar113._12_4_;
                        auVar145._8_8_ = 0;
                        auVar145._0_8_ = *(ulong *)(lVar74 + 0x30);
                        auVar113 = vpmovzxbd_avx(auVar145);
                        auVar113 = vcvtdq2ps_avx(auVar113);
                        fVar187 = *(float *)(lVar74 + 0x4c);
                        fVar194 = *(float *)(lVar74 + 0x40);
                        local_1a00[0] = fVar194 + fVar187 * auVar113._0_4_;
                        local_1a00[1] = fVar194 + fVar187 * auVar113._4_4_;
                        local_1a00[2] = fVar194 + fVar187 * auVar113._8_4_;
                        local_1a00[3] = fVar194 + fVar187 * auVar113._12_4_;
                        fVar125 = local_1a00[lVar72];
                        auVar190._8_8_ = 0;
                        auVar190._0_8_ = *(ulong *)(lVar74 + 0x60);
                        auVar113 = vpmovzxbd_avx(auVar190);
                        auVar113 = vcvtdq2ps_avx(auVar113);
                        fVar126 = *(float *)(lVar74 + 0x7c);
                        fVar127 = *(float *)(lVar74 + 0x70);
                        local_1b30[0] = fVar127 + fVar126 * auVar113._0_4_;
                        local_1b30[1] = fVar127 + fVar126 * auVar113._4_4_;
                        local_1b30[2] = fVar127 + fVar126 * auVar113._8_4_;
                        local_1b30[3] = fVar127 + fVar126 * auVar113._12_4_;
                        auVar113 = vshufps_avx(ZEXT416((uint)(local_1b30[lVar72] - fVar125)),
                                               ZEXT416((uint)(local_1b30[lVar72] - fVar125)),0);
                        auVar146._0_4_ = fVar125 + fVar128 * auVar113._0_4_;
                        auVar146._4_4_ = fVar125 + fVar129 * auVar113._4_4_;
                        auVar146._8_4_ = fVar125 + fVar152 * auVar113._8_4_;
                        auVar146._12_4_ = fVar125 + fVar153 * auVar113._12_4_;
                        auVar191._8_8_ = 0;
                        auVar191._0_8_ = *(ulong *)(lVar74 + 0x34);
                        auVar113 = vpmovzxbd_avx(auVar191);
                        auVar113 = vcvtdq2ps_avx(auVar113);
                        local_1a00[0] = fVar194 + fVar187 * auVar113._0_4_;
                        local_1a00[1] = fVar194 + fVar187 * auVar113._4_4_;
                        local_1a00[2] = fVar194 + fVar187 * auVar113._8_4_;
                        local_1a00[3] = fVar194 + fVar187 * auVar113._12_4_;
                        fVar187 = local_1a00[lVar72];
                        auVar181._8_8_ = 0;
                        auVar181._0_8_ = *(ulong *)(lVar74 + 100);
                        auVar113 = vpmovzxbd_avx(auVar181);
                        auVar113 = vcvtdq2ps_avx(auVar113);
                        local_1b30[0] = fVar127 + fVar126 * auVar113._0_4_;
                        local_1b30[1] = fVar127 + fVar126 * auVar113._4_4_;
                        local_1b30[2] = fVar127 + fVar126 * auVar113._8_4_;
                        local_1b30[3] = fVar127 + fVar126 * auVar113._12_4_;
                        auVar113 = vshufps_avx(ZEXT416((uint)(local_1b30[lVar72] - fVar187)),
                                               ZEXT416((uint)(local_1b30[lVar72] - fVar187)),0);
                        auVar167._0_4_ = fVar187 + fVar128 * auVar113._0_4_;
                        auVar167._4_4_ = fVar187 + fVar129 * auVar113._4_4_;
                        auVar167._8_4_ = fVar187 + fVar152 * auVar113._8_4_;
                        auVar167._12_4_ = fVar187 + fVar153 * auVar113._12_4_;
                        auVar62._8_8_ = local_1c10._8_8_;
                        auVar62._0_8_ = local_1c10._0_8_;
                        auVar64._8_8_ = local_1c10._24_8_;
                        auVar64._0_8_ = local_1c10._16_8_;
                        auVar66._8_8_ = local_1c10._40_8_;
                        auVar66._0_8_ = local_1c10._32_8_;
                        auVar113 = vsubps_avx(auVar90,auVar62);
                        auVar91._0_4_ = local_1bb0._0_4_ * auVar113._0_4_;
                        auVar91._4_4_ = local_1bb0._4_4_ * auVar113._4_4_;
                        auVar91._8_4_ = local_1bb0._8_4_ * auVar113._8_4_;
                        auVar91._12_4_ = local_1bb0._12_4_ * auVar113._12_4_;
                        auVar113 = vsubps_avx(auVar116,auVar64);
                        auVar117._0_4_ = local_1ba0._0_4_ * auVar113._0_4_;
                        auVar117._4_4_ = local_1ba0._4_4_ * auVar113._4_4_;
                        auVar117._8_4_ = local_1ba0._8_4_ * auVar113._8_4_;
                        auVar117._12_4_ = local_1ba0._12_4_ * auVar113._12_4_;
                        auVar123 = ZEXT1664(auVar117);
                        auVar113 = vsubps_avx(auVar146,auVar66);
                        auVar147._0_4_ = local_1b90._0_4_ * auVar113._0_4_;
                        auVar147._4_4_ = local_1b90._4_4_ * auVar113._4_4_;
                        auVar147._8_4_ = local_1b90._8_4_ * auVar113._8_4_;
                        auVar147._12_4_ = local_1b90._12_4_ * auVar113._12_4_;
                        auVar113 = vsubps_avx(auVar103,auVar62);
                        auVar104._0_4_ = local_1bb0._0_4_ * auVar113._0_4_;
                        auVar104._4_4_ = local_1bb0._4_4_ * auVar113._4_4_;
                        auVar104._8_4_ = local_1bb0._8_4_ * auVar113._8_4_;
                        auVar104._12_4_ = local_1bb0._12_4_ * auVar113._12_4_;
                        auVar113 = vsubps_avx(auVar134,auVar64);
                        auVar135._0_4_ = local_1ba0._0_4_ * auVar113._0_4_;
                        auVar135._4_4_ = local_1ba0._4_4_ * auVar113._4_4_;
                        auVar135._8_4_ = local_1ba0._8_4_ * auVar113._8_4_;
                        auVar135._12_4_ = local_1ba0._12_4_ * auVar113._12_4_;
                        auVar113 = vsubps_avx(auVar167,auVar66);
                        auVar168._0_4_ = local_1b90._0_4_ * auVar113._0_4_;
                        auVar168._4_4_ = local_1b90._4_4_ * auVar113._4_4_;
                        auVar168._8_4_ = local_1b90._8_4_ * auVar113._8_4_;
                        auVar168._12_4_ = local_1b90._12_4_ * auVar113._12_4_;
                        auVar113 = vminps_avx(auVar91,auVar104);
                        auVar139 = vminps_avx(auVar117,auVar135);
                        auVar113 = vmaxps_avx(auVar113,auVar139);
                        auVar139 = vminps_avx(auVar147,auVar168);
                        auVar113 = vmaxps_avx(auVar113,auVar139);
                        auVar182._0_4_ = auVar113._0_4_ * 0.99999964;
                        auVar182._4_4_ = auVar113._4_4_ * 0.99999964;
                        auVar182._8_4_ = auVar113._8_4_ * 0.99999964;
                        auVar182._12_4_ = auVar113._12_4_ * 0.99999964;
                        auVar113 = vmaxps_avx(auVar91,auVar104);
                        auVar139 = vmaxps_avx(auVar117,auVar135);
                        auVar139 = vminps_avx(auVar113,auVar139);
                        auVar113 = vmaxps_avx(auVar147,auVar168);
                        auVar113 = vminps_avx(auVar139,auVar113);
                        auVar92._0_4_ = auVar113._0_4_ * 1.0000004;
                        auVar92._4_4_ = auVar113._4_4_ * 1.0000004;
                        auVar92._8_4_ = auVar113._8_4_ * 1.0000004;
                        auVar92._12_4_ = auVar113._12_4_ * 1.0000004;
                        auVar113 = vmaxps_avx(auVar182,local_1b50);
                        auVar139 = vminps_avx(auVar92,local_1b40);
                        auVar113 = vcmpps_avx(auVar113,auVar139,2);
                        auVar113 = auVar87 & auVar113;
                        if ((((auVar113 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                             (auVar113 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar113 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            -1 < auVar113[0xf]) {
                          bVar85 = false;
                        }
                        else {
                          uVar2 = *(ushort *)(lVar74 + lVar72 * 8);
                          uVar67 = *(uint *)(lVar74 + 0x88);
                          uVar3 = *(uint *)(lVar74 + 4 + lVar72 * 8);
                          uVar70 = vmovmskps_avx(auVar87);
                          local_1c50 = auVar87;
                          if (uVar70 != 0) {
                            local_1a30 = auVar87;
                            uVar76 = (ulong)(uVar70 & 0xff);
                            local_1dc4 = uVar2 & 0x7fff;
                            local_1dc8 = (uint)*(ushort *)(lVar74 + 2 + lVar72 * 8);
                            local_1dcc = local_1dc8 & 0x7fff;
                            local_1cd0 = (ulong)(-1 < (short)uVar2);
                            auVar87 = vpshufd_avx(ZEXT416(local_1dc4),0);
                            auVar87 = vpaddd_avx(auVar87,_DAT_01fab9b0);
                            auVar113 = vpshufd_avx(ZEXT416(local_1dcc),0);
                            auVar113 = vpaddd_avx(auVar113,_DAT_01fab9c0);
                            auVar97._16_16_ = auVar87;
                            auVar97._0_16_ = auVar87;
                            _local_1820 = vcvtdq2ps_avx(auVar97);
                            auVar98._16_16_ = auVar113;
                            auVar98._0_16_ = auVar113;
                            _local_1840 = vcvtdq2ps_avx(auVar98);
                            local_1a40 = vpshufd_avx(ZEXT416(uVar67),0);
                            local_1a50 = vpshufd_avx(ZEXT416(uVar3),0);
                            pRVar82 = ray;
                            pRVar83 = context;
                            local_1ce0 = uVar71;
                            local_1cc8 = (ulong)uVar3;
                            do {
                              context = local_1cd8;
                              ray = local_1dd8;
                              local_1d30._0_8_ = uVar76;
                              lVar74 = 0;
                              if (uVar76 != 0) {
                                for (; (uVar76 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
                                }
                              }
                              local_1cb0 = pRVar83->scene;
                              pGVar77 = (local_1cb0->geometries).items[uVar67].ptr;
                              local_1cb8 = *(long *)&pGVar77->field_0x58;
                              local_1cc0 = pGVar77[1].super_RefCount.refCounter.
                                           super___atomic_base<unsigned_long>._M_i * local_1cc8;
                              fVar187 = (pGVar77->time_range).lower;
                              auVar93._4_4_ = fVar187;
                              auVar93._0_4_ = fVar187;
                              auVar93._8_4_ = fVar187;
                              auVar93._12_4_ = fVar187;
                              fVar194 = pGVar77->fnumTimeSegments;
                              auVar113 = vsubps_avx(*(undefined1 (*) [16])(pRVar82 + 0x70),auVar93);
                              auVar87 = ZEXT416((uint)((pGVar77->time_range).upper - fVar187));
                              auVar87 = vshufps_avx(auVar87,auVar87,0);
                              auVar87 = vdivps_avx(auVar113,auVar87);
                              auVar94._0_4_ = fVar194 * auVar87._0_4_;
                              auVar94._4_4_ = fVar194 * auVar87._4_4_;
                              auVar94._8_4_ = fVar194 * auVar87._8_4_;
                              auVar94._12_4_ = fVar194 * auVar87._12_4_;
                              auVar87 = vroundps_avx(auVar94,1);
                              auVar113 = vshufps_avx(ZEXT416((uint)(fVar194 + -1.0)),
                                                     ZEXT416((uint)(fVar194 + -1.0)),0);
                              auVar87 = vminps_avx(auVar87,auVar113);
                              auVar87 = vmaxps_avx(auVar87,_DAT_01f7aa10);
                              local_1a10 = vsubps_avx(auVar94,auVar87);
                              local_1a20 = vcvtps2dq_avx(auVar87);
                              uVar3 = *(uint *)(local_1cb8 + 4 + local_1cc0);
                              uVar76 = CONCAT44(0,uVar3);
                              uVar81 = (ulong)(uVar3 * local_1dcc +
                                              *(int *)(local_1cb8 + local_1cc0) + local_1dc4);
                              lVar4 = *(long *)&pGVar77[2].numPrimitives;
                              lVar75 = (long)*(int *)(local_1a20 + lVar74 * 4) * 0x38;
                              lVar5 = *(long *)(lVar4 + lVar75);
                              lVar6 = *(long *)(lVar4 + 0x10 + lVar75);
                              lVar7 = *(long *)(lVar4 + 0x48 + lVar75);
                              auVar87 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar81);
                              auVar113 = *(undefined1 (*) [16])(lVar5 + (uVar81 + 1) * lVar6);
                              local_1aa0._0_8_ = uVar76;
                              lVar72 = uVar81 + uVar76;
                              auVar101 = *(undefined1 (*) [16])(lVar5 + lVar72 * lVar6);
                              lVar84 = uVar81 + uVar76 + 1;
                              auVar139 = *(undefined1 (*) [16])(lVar5 + lVar84 * lVar6);
                              lVar73 = uVar81 + local_1cd0 + 1;
                              auVar100 = *(undefined1 (*) [16])(lVar5 + lVar73 * lVar6);
                              lVar1 = lVar84 + local_1cd0;
                              uVar71 = 0;
                              if (-1 < (short)local_1dc8) {
                                uVar71 = uVar76;
                              }
                              auVar140 = *(undefined1 (*) [16])(lVar5 + lVar1 * lVar6);
                              auVar160 = *(undefined1 (*) [16])(lVar5 + (lVar72 + uVar71) * lVar6);
                              auVar175 = *(undefined1 (*) [16])(lVar5 + (lVar84 + uVar71) * lVar6);
                              auVar176 = *(undefined1 (*) [16])(lVar5 + lVar6 * (uVar71 + lVar1));
                              lVar4 = *(long *)(lVar4 + 0x38 + lVar75);
                              fVar187 = local_1a00[lVar74 + -4];
                              auVar177 = vsubps_avx(*(undefined1 (*) [16])(lVar4 + lVar7 * uVar81),
                                                    auVar87);
                              auVar118._0_4_ = fVar187 * auVar177._0_4_ + auVar87._0_4_;
                              auVar118._4_4_ = fVar187 * auVar177._4_4_ + auVar87._4_4_;
                              auVar118._8_4_ = fVar187 * auVar177._8_4_ + auVar87._8_4_;
                              auVar118._12_4_ = fVar187 * auVar177._12_4_ + auVar87._12_4_;
                              auVar87 = vsubps_avx(*(undefined1 (*) [16])
                                                    (lVar4 + lVar7 * (uVar81 + 1)),auVar113);
                              auVar222._0_4_ = fVar187 * auVar87._0_4_ + auVar113._0_4_;
                              auVar222._4_4_ = fVar187 * auVar87._4_4_ + auVar113._4_4_;
                              auVar222._8_4_ = fVar187 * auVar87._8_4_ + auVar113._8_4_;
                              auVar222._12_4_ = fVar187 * auVar87._12_4_ + auVar113._12_4_;
                              auVar87 = vsubps_avx(*(undefined1 (*) [16])(lVar4 + lVar7 * lVar72),
                                                   auVar101);
                              auVar95._0_4_ = fVar187 * auVar87._0_4_ + auVar101._0_4_;
                              auVar95._4_4_ = fVar187 * auVar87._4_4_ + auVar101._4_4_;
                              auVar95._8_4_ = fVar187 * auVar87._8_4_ + auVar101._8_4_;
                              auVar95._12_4_ = fVar187 * auVar87._12_4_ + auVar101._12_4_;
                              auVar87 = vsubps_avx(*(undefined1 (*) [16])(lVar4 + lVar7 * lVar84),
                                                   auVar139);
                              auVar105._0_4_ = fVar187 * auVar87._0_4_ + auVar139._0_4_;
                              auVar105._4_4_ = fVar187 * auVar87._4_4_ + auVar139._4_4_;
                              auVar105._8_4_ = fVar187 * auVar87._8_4_ + auVar139._8_4_;
                              auVar105._12_4_ = fVar187 * auVar87._12_4_ + auVar139._12_4_;
                              auVar87 = vsubps_avx(*(undefined1 (*) [16])(lVar4 + lVar7 * lVar73),
                                                   auVar100);
                              auVar148._0_4_ = fVar187 * auVar87._0_4_ + auVar100._0_4_;
                              auVar148._4_4_ = fVar187 * auVar87._4_4_ + auVar100._4_4_;
                              auVar148._8_4_ = fVar187 * auVar87._8_4_ + auVar100._8_4_;
                              auVar148._12_4_ = fVar187 * auVar87._12_4_ + auVar100._12_4_;
                              auVar87 = vsubps_avx(*(undefined1 (*) [16])(lVar4 + lVar7 * lVar1),
                                                   auVar140);
                              auVar169._0_4_ = fVar187 * auVar87._0_4_ + auVar140._0_4_;
                              auVar169._4_4_ = fVar187 * auVar87._4_4_ + auVar140._4_4_;
                              auVar169._8_4_ = fVar187 * auVar87._8_4_ + auVar140._8_4_;
                              auVar169._12_4_ = fVar187 * auVar87._12_4_ + auVar140._12_4_;
                              auVar87 = vsubps_avx(*(undefined1 (*) [16])
                                                    (lVar4 + lVar7 * (lVar72 + uVar71)),auVar160);
                              auVar136._0_4_ = auVar160._0_4_ + fVar187 * auVar87._0_4_;
                              auVar136._4_4_ = auVar160._4_4_ + fVar187 * auVar87._4_4_;
                              auVar136._8_4_ = auVar160._8_4_ + fVar187 * auVar87._8_4_;
                              auVar136._12_4_ = auVar160._12_4_ + fVar187 * auVar87._12_4_;
                              auVar87 = vsubps_avx(*(undefined1 (*) [16])
                                                    (lVar4 + lVar7 * (lVar84 + uVar71)),auVar175);
                              auVar183._0_4_ = auVar175._0_4_ + fVar187 * auVar87._0_4_;
                              auVar183._4_4_ = auVar175._4_4_ + fVar187 * auVar87._4_4_;
                              auVar183._8_4_ = auVar175._8_4_ + fVar187 * auVar87._8_4_;
                              auVar183._12_4_ = auVar175._12_4_ + fVar187 * auVar87._12_4_;
                              auVar87 = vsubps_avx(*(undefined1 (*) [16])
                                                    (lVar4 + (uVar71 + lVar1) * lVar7),auVar176);
                              auVar192._0_4_ = auVar176._0_4_ + fVar187 * auVar87._0_4_;
                              auVar192._4_4_ = auVar176._4_4_ + fVar187 * auVar87._4_4_;
                              auVar192._8_4_ = auVar176._8_4_ + fVar187 * auVar87._8_4_;
                              auVar192._12_4_ = auVar176._12_4_ + fVar187 * auVar87._12_4_;
                              auVar139 = vunpcklps_avx(auVar118,auVar105);
                              auVar87 = vunpckhps_avx(auVar118,auVar105);
                              auVar100 = vunpcklps_avx(auVar222,auVar95);
                              auVar113 = vunpckhps_avx(auVar222,auVar95);
                              auVar140 = vunpcklps_avx(auVar87,auVar113);
                              auVar160 = vunpcklps_avx(auVar139,auVar100);
                              auVar87 = vunpckhps_avx(auVar139,auVar100);
                              auVar100 = vunpcklps_avx(auVar222,auVar169);
                              auVar113 = vunpckhps_avx(auVar222,auVar169);
                              auVar101 = vunpcklps_avx(auVar148,auVar105);
                              auVar139 = vunpckhps_avx(auVar148,auVar105);
                              auVar175 = vunpcklps_avx(auVar113,auVar139);
                              auVar176 = vunpcklps_avx(auVar100,auVar101);
                              auVar113 = vunpckhps_avx(auVar100,auVar101);
                              auVar101 = vunpcklps_avx(auVar105,auVar192);
                              auVar139 = vunpckhps_avx(auVar105,auVar192);
                              auVar177 = vunpcklps_avx(auVar169,auVar183);
                              auVar100 = vunpckhps_avx(auVar169,auVar183);
                              auVar207 = vunpcklps_avx(auVar139,auVar100);
                              auVar208 = vunpcklps_avx(auVar101,auVar177);
                              auVar139 = vunpckhps_avx(auVar101,auVar177);
                              auVar177 = vunpcklps_avx(auVar95,auVar183);
                              auVar100 = vunpckhps_avx(auVar95,auVar183);
                              auVar221 = vunpcklps_avx(auVar105,auVar136);
                              auVar101 = vunpckhps_avx(auVar105,auVar136);
                              auVar101 = vunpcklps_avx(auVar100,auVar101);
                              auVar28 = vunpcklps_avx(auVar177,auVar221);
                              auVar100 = vunpckhps_avx(auVar177,auVar221);
                              auVar184._16_16_ = auVar208;
                              auVar184._0_16_ = auVar160;
                              auVar193._16_16_ = auVar139;
                              auVar193._0_16_ = auVar87;
                              auVar122._16_16_ = auVar207;
                              auVar122._0_16_ = auVar140;
                              auVar210._16_16_ = auVar176;
                              auVar210._0_16_ = auVar176;
                              auVar223._16_16_ = auVar113;
                              auVar223._0_16_ = auVar113;
                              auVar149._16_16_ = auVar175;
                              auVar149._0_16_ = auVar175;
                              auVar233._16_16_ = auVar28;
                              auVar233._0_16_ = auVar28;
                              auVar137._16_16_ = auVar100;
                              auVar137._0_16_ = auVar100;
                              auVar240._16_16_ = auVar101;
                              auVar240._0_16_ = auVar101;
                              uVar68 = *(undefined4 *)(local_1dd8 + lVar74 * 4);
                              auVar244._4_4_ = uVar68;
                              auVar244._0_4_ = uVar68;
                              auVar244._8_4_ = uVar68;
                              auVar244._12_4_ = uVar68;
                              auVar244._16_4_ = uVar68;
                              auVar244._20_4_ = uVar68;
                              auVar244._24_4_ = uVar68;
                              auVar244._28_4_ = uVar68;
                              uVar68 = *(undefined4 *)(local_1dd8 + lVar74 * 4 + 0x10);
                              auVar264._4_4_ = uVar68;
                              auVar264._0_4_ = uVar68;
                              auVar264._8_4_ = uVar68;
                              auVar264._12_4_ = uVar68;
                              auVar264._16_4_ = uVar68;
                              auVar264._20_4_ = uVar68;
                              auVar264._24_4_ = uVar68;
                              auVar264._28_4_ = uVar68;
                              uVar68 = *(undefined4 *)(local_1dd8 + lVar74 * 4 + 0x20);
                              auVar268._4_4_ = uVar68;
                              auVar268._0_4_ = uVar68;
                              auVar268._8_4_ = uVar68;
                              auVar268._12_4_ = uVar68;
                              auVar268._16_4_ = uVar68;
                              auVar268._20_4_ = uVar68;
                              auVar268._24_4_ = uVar68;
                              auVar268._28_4_ = uVar68;
                              local_1ca0 = vsubps_avx(auVar184,auVar244);
                              local_1aa0 = vsubps_avx(auVar193,auVar264);
                              local_1720 = vsubps_avx(auVar122,auVar268);
                              auVar96 = vsubps_avx(auVar210,auVar244);
                              auVar98 = vsubps_avx(auVar223,auVar264);
                              auVar121 = vsubps_avx(auVar149,auVar268);
                              auVar97 = vsubps_avx(auVar233,auVar244);
                              auVar23 = vsubps_avx(auVar137,auVar264);
                              auVar24 = vsubps_avx(auVar240,auVar268);
                              local_1740 = vsubps_avx(auVar97,local_1ca0);
                              local_1760 = vsubps_avx(auVar23,local_1aa0);
                              local_1780 = vsubps_avx(auVar24,local_1720);
                              fVar125 = local_1aa0._0_4_;
                              fVar187 = auVar23._0_4_ + fVar125;
                              fVar128 = local_1aa0._4_4_;
                              fVar194 = auVar23._4_4_ + fVar128;
                              fVar153 = local_1aa0._8_4_;
                              fVar196 = auVar23._8_4_ + fVar153;
                              fVar156 = local_1aa0._12_4_;
                              fVar198 = auVar23._12_4_ + fVar156;
                              fVar9 = local_1aa0._16_4_;
                              fVar200 = auVar23._16_4_ + fVar9;
                              fVar12 = local_1aa0._20_4_;
                              fVar202 = auVar23._20_4_ + fVar12;
                              fVar15 = local_1aa0._24_4_;
                              fVar204 = auVar23._24_4_ + fVar15;
                              fVar126 = local_1720._0_4_;
                              fVar219 = auVar24._0_4_ + fVar126;
                              fVar129 = local_1720._4_4_;
                              fVar225 = auVar24._4_4_ + fVar129;
                              fVar154 = local_1720._8_4_;
                              fVar226 = auVar24._8_4_ + fVar154;
                              fVar158 = local_1720._12_4_;
                              fVar227 = auVar24._12_4_ + fVar158;
                              fVar10 = local_1720._16_4_;
                              fVar228 = auVar24._16_4_ + fVar10;
                              fVar13 = local_1720._20_4_;
                              fVar229 = auVar24._20_4_ + fVar13;
                              fVar16 = local_1720._24_4_;
                              fVar230 = auVar24._24_4_ + fVar16;
                              fVar220 = local_1720._28_4_;
                              fVar231 = auVar24._28_4_ + fVar220;
                              fVar18 = local_1780._0_4_;
                              fVar19 = local_1780._4_4_;
                              auVar25._4_4_ = fVar194 * fVar19;
                              auVar25._0_4_ = fVar187 * fVar18;
                              fVar20 = local_1780._8_4_;
                              auVar25._8_4_ = fVar196 * fVar20;
                              fVar21 = local_1780._12_4_;
                              auVar25._12_4_ = fVar198 * fVar21;
                              fVar22 = local_1780._16_4_;
                              auVar25._16_4_ = fVar200 * fVar22;
                              fVar112 = local_1780._20_4_;
                              auVar25._20_4_ = fVar202 * fVar112;
                              fVar124 = local_1780._24_4_;
                              auVar25._24_4_ = fVar204 * fVar124;
                              auVar25._28_4_ = auVar28._12_4_;
                              fVar275 = local_1760._0_4_;
                              fVar278 = local_1760._4_4_;
                              auVar26._4_4_ = fVar278 * fVar225;
                              auVar26._0_4_ = fVar275 * fVar219;
                              fVar280 = local_1760._8_4_;
                              auVar26._8_4_ = fVar280 * fVar226;
                              fVar282 = local_1760._12_4_;
                              auVar26._12_4_ = fVar282 * fVar227;
                              fVar284 = local_1760._16_4_;
                              auVar26._16_4_ = fVar284 * fVar228;
                              fVar286 = local_1760._20_4_;
                              auVar26._20_4_ = fVar286 * fVar229;
                              fVar288 = local_1760._24_4_;
                              auVar26._24_4_ = fVar288 * fVar230;
                              auVar26._28_4_ = auVar101._12_4_;
                              auVar25 = vsubps_avx(auVar26,auVar25);
                              fVar127 = local_1ca0._0_4_;
                              fVar232 = auVar97._0_4_ + fVar127;
                              fVar152 = local_1ca0._4_4_;
                              fVar234 = auVar97._4_4_ + fVar152;
                              fVar155 = local_1ca0._8_4_;
                              fVar235 = auVar97._8_4_ + fVar155;
                              fVar159 = local_1ca0._12_4_;
                              fVar236 = auVar97._12_4_ + fVar159;
                              fVar11 = local_1ca0._16_4_;
                              fVar237 = auVar97._16_4_ + fVar11;
                              fVar14 = local_1ca0._20_4_;
                              fVar238 = auVar97._20_4_ + fVar14;
                              fVar17 = local_1ca0._24_4_;
                              fVar239 = auVar97._24_4_ + fVar17;
                              fVar241 = local_1740._0_4_;
                              fVar245 = local_1740._4_4_;
                              auVar27._4_4_ = fVar245 * fVar225;
                              auVar27._0_4_ = fVar241 * fVar219;
                              fVar248 = local_1740._8_4_;
                              auVar27._8_4_ = fVar248 * fVar226;
                              fVar251 = local_1740._12_4_;
                              auVar27._12_4_ = fVar251 * fVar227;
                              fVar254 = local_1740._16_4_;
                              auVar27._16_4_ = fVar254 * fVar228;
                              fVar257 = local_1740._20_4_;
                              auVar27._20_4_ = fVar257 * fVar229;
                              fVar260 = local_1740._24_4_;
                              auVar27._24_4_ = fVar260 * fVar230;
                              auVar27._28_4_ = fVar231;
                              auVar122 = local_1780;
                              auVar30._4_4_ = fVar234 * fVar19;
                              auVar30._0_4_ = fVar232 * fVar18;
                              auVar30._8_4_ = fVar235 * fVar20;
                              auVar30._12_4_ = fVar236 * fVar21;
                              auVar30._16_4_ = fVar237 * fVar22;
                              auVar30._20_4_ = fVar238 * fVar112;
                              auVar30._24_4_ = fVar239 * fVar124;
                              auVar30._28_4_ = auVar101._12_4_;
                              auVar26 = vsubps_avx(auVar30,auVar27);
                              auVar31._4_4_ = fVar234 * fVar278;
                              auVar31._0_4_ = fVar232 * fVar275;
                              auVar31._8_4_ = fVar235 * fVar280;
                              auVar31._12_4_ = fVar236 * fVar282;
                              auVar31._16_4_ = fVar237 * fVar284;
                              auVar31._20_4_ = fVar238 * fVar286;
                              auVar31._24_4_ = fVar239 * fVar288;
                              auVar31._28_4_ = fVar231;
                              auVar32._4_4_ = fVar245 * fVar194;
                              auVar32._0_4_ = fVar241 * fVar187;
                              auVar32._8_4_ = fVar248 * fVar196;
                              auVar32._12_4_ = fVar251 * fVar198;
                              auVar32._16_4_ = fVar254 * fVar200;
                              auVar32._20_4_ = fVar257 * fVar202;
                              auVar32._24_4_ = fVar260 * fVar204;
                              auVar32._28_4_ = auVar23._28_4_ + local_1aa0._28_4_;
                              auVar27 = vsubps_avx(auVar32,auVar31);
                              fVar187 = *(float *)(local_1dd8 + lVar74 * 4 + 0x50);
                              local_1d80._4_4_ = fVar187;
                              local_1d80._0_4_ = fVar187;
                              local_1d80._8_4_ = fVar187;
                              local_1d80._12_4_ = fVar187;
                              local_1d80._16_4_ = fVar187;
                              local_1d80._20_4_ = fVar187;
                              local_1d80._24_4_ = fVar187;
                              local_1d80._28_4_ = fVar187;
                              fVar194 = *(float *)(local_1dd8 + lVar74 * 4 + 0x60);
                              local_1da0._4_4_ = fVar194;
                              local_1da0._0_4_ = fVar194;
                              local_1da0._8_4_ = fVar194;
                              local_1da0._12_4_ = fVar194;
                              local_1da0._16_4_ = fVar194;
                              local_1da0._20_4_ = fVar194;
                              local_1da0._24_4_ = fVar194;
                              local_1da0._28_4_ = fVar194;
                              auVar123 = ZEXT3264(local_1da0);
                              local_1c80._4_4_ = *(undefined4 *)(local_1dd8 + lVar74 * 4 + 0x40);
                              local_1c80._0_4_ = local_1c80._4_4_;
                              fStack_1c78 = (float)local_1c80._4_4_;
                              fStack_1c74 = (float)local_1c80._4_4_;
                              fStack_1c70 = (float)local_1c80._4_4_;
                              fStack_1c6c = (float)local_1c80._4_4_;
                              fStack_1c68 = (float)local_1c80._4_4_;
                              fStack_1c64 = (float)local_1c80._4_4_;
                              local_17e0._0_4_ =
                                   auVar25._0_4_ * (float)local_1c80._4_4_ +
                                   fVar187 * auVar26._0_4_ + auVar27._0_4_ * fVar194;
                              local_17e0._4_4_ =
                                   auVar25._4_4_ * (float)local_1c80._4_4_ +
                                   fVar187 * auVar26._4_4_ + auVar27._4_4_ * fVar194;
                              local_17e0._8_4_ =
                                   auVar25._8_4_ * (float)local_1c80._4_4_ +
                                   fVar187 * auVar26._8_4_ + auVar27._8_4_ * fVar194;
                              local_17e0._12_4_ =
                                   auVar25._12_4_ * (float)local_1c80._4_4_ +
                                   fVar187 * auVar26._12_4_ + auVar27._12_4_ * fVar194;
                              local_17e0._16_4_ =
                                   auVar25._16_4_ * (float)local_1c80._4_4_ +
                                   fVar187 * auVar26._16_4_ + auVar27._16_4_ * fVar194;
                              local_17e0._20_4_ =
                                   auVar25._20_4_ * (float)local_1c80._4_4_ +
                                   fVar187 * auVar26._20_4_ + auVar27._20_4_ * fVar194;
                              local_17e0._24_4_ =
                                   auVar25._24_4_ * (float)local_1c80._4_4_ +
                                   fVar187 * auVar26._24_4_ + auVar27._24_4_ * fVar194;
                              local_17e0._28_4_ = auVar25._28_4_ + auVar26._28_4_ + auVar27._28_4_;
                              local_17a0 = vsubps_avx(local_1aa0,auVar98);
                              local_17c0 = vsubps_avx(local_1720,auVar121);
                              fVar227 = auVar98._0_4_ + fVar125;
                              fVar228 = auVar98._4_4_ + fVar128;
                              fVar229 = auVar98._8_4_ + fVar153;
                              fVar230 = auVar98._12_4_ + fVar156;
                              fVar231 = auVar98._16_4_ + fVar9;
                              fVar232 = auVar98._20_4_ + fVar12;
                              fVar234 = auVar98._24_4_ + fVar15;
                              fVar198 = fVar126 + auVar121._0_4_;
                              fVar200 = fVar129 + auVar121._4_4_;
                              fVar202 = fVar154 + auVar121._8_4_;
                              fVar204 = fVar158 + auVar121._12_4_;
                              fVar219 = fVar10 + auVar121._16_4_;
                              fVar225 = fVar13 + auVar121._20_4_;
                              fVar226 = fVar16 + auVar121._24_4_;
                              fVar196 = auVar121._28_4_;
                              fVar242 = local_17c0._0_4_;
                              fVar246 = local_17c0._4_4_;
                              auVar33._4_4_ = fVar246 * fVar228;
                              auVar33._0_4_ = fVar242 * fVar227;
                              fVar249 = local_17c0._8_4_;
                              auVar33._8_4_ = fVar249 * fVar229;
                              fVar252 = local_17c0._12_4_;
                              auVar33._12_4_ = fVar252 * fVar230;
                              fVar255 = local_17c0._16_4_;
                              auVar33._16_4_ = fVar255 * fVar231;
                              fVar258 = local_17c0._20_4_;
                              auVar33._20_4_ = fVar258 * fVar232;
                              fVar261 = local_17c0._24_4_;
                              auVar33._24_4_ = fVar261 * fVar234;
                              auVar33._28_4_ = auVar26._28_4_;
                              fVar276 = local_17a0._0_4_;
                              fVar279 = local_17a0._4_4_;
                              auVar34._4_4_ = fVar279 * fVar200;
                              auVar34._0_4_ = fVar276 * fVar198;
                              fVar281 = local_17a0._8_4_;
                              auVar34._8_4_ = fVar281 * fVar202;
                              fVar283 = local_17a0._12_4_;
                              auVar34._12_4_ = fVar283 * fVar204;
                              fVar285 = local_17a0._16_4_;
                              auVar34._16_4_ = fVar285 * fVar219;
                              fVar287 = local_17a0._20_4_;
                              auVar34._20_4_ = fVar287 * fVar225;
                              fVar289 = local_17a0._24_4_;
                              auVar34._24_4_ = fVar289 * fVar226;
                              auVar34._28_4_ = fVar220;
                              auVar25 = vsubps_avx(auVar34,auVar33);
                              auVar26 = vsubps_avx(local_1ca0,auVar96);
                              fVar266 = auVar26._0_4_;
                              fVar269 = auVar26._4_4_;
                              auVar35._4_4_ = fVar269 * fVar200;
                              auVar35._0_4_ = fVar266 * fVar198;
                              fVar270 = auVar26._8_4_;
                              auVar35._8_4_ = fVar270 * fVar202;
                              fVar271 = auVar26._12_4_;
                              auVar35._12_4_ = fVar271 * fVar204;
                              fVar272 = auVar26._16_4_;
                              auVar35._16_4_ = fVar272 * fVar219;
                              fVar273 = auVar26._20_4_;
                              auVar35._20_4_ = fVar273 * fVar225;
                              fVar274 = auVar26._24_4_;
                              auVar35._24_4_ = fVar274 * fVar226;
                              auVar35._28_4_ = fVar220 + fVar196;
                              fVar220 = fVar127 + auVar96._0_4_;
                              fVar198 = fVar152 + auVar96._4_4_;
                              fVar200 = fVar155 + auVar96._8_4_;
                              fVar202 = fVar159 + auVar96._12_4_;
                              fVar204 = fVar11 + auVar96._16_4_;
                              fVar219 = fVar14 + auVar96._20_4_;
                              fVar225 = fVar17 + auVar96._24_4_;
                              auVar36._4_4_ = fVar198 * fVar246;
                              auVar36._0_4_ = fVar220 * fVar242;
                              auVar36._8_4_ = fVar200 * fVar249;
                              auVar36._12_4_ = fVar202 * fVar252;
                              auVar36._16_4_ = fVar204 * fVar255;
                              auVar36._20_4_ = fVar219 * fVar258;
                              auVar36._24_4_ = fVar225 * fVar261;
                              auVar36._28_4_ = local_17c0._28_4_;
                              auVar26 = vsubps_avx(auVar36,auVar35);
                              auVar37._4_4_ = fVar198 * fVar279;
                              auVar37._0_4_ = fVar220 * fVar276;
                              auVar37._8_4_ = fVar200 * fVar281;
                              auVar37._12_4_ = fVar202 * fVar283;
                              auVar37._16_4_ = fVar204 * fVar285;
                              auVar37._20_4_ = fVar219 * fVar287;
                              auVar37._24_4_ = fVar225 * fVar289;
                              auVar37._28_4_ = local_1ca0._28_4_ + auVar96._28_4_;
                              auVar38._4_4_ = fVar269 * fVar228;
                              auVar38._0_4_ = fVar266 * fVar227;
                              auVar38._8_4_ = fVar270 * fVar229;
                              auVar38._12_4_ = fVar271 * fVar230;
                              auVar38._16_4_ = fVar272 * fVar231;
                              auVar38._20_4_ = fVar273 * fVar232;
                              auVar38._24_4_ = fVar274 * fVar234;
                              auVar38._28_4_ = auVar98._28_4_ + local_1aa0._28_4_;
                              auVar27 = vsubps_avx(auVar38,auVar37);
                              fVar174 = auVar27._28_4_ + auVar26._28_4_;
                              local_1800._0_4_ =
                                   (float)local_1c80._4_4_ * auVar25._0_4_ +
                                   auVar27._0_4_ * fVar194 + fVar187 * auVar26._0_4_;
                              local_1800._4_4_ =
                                   (float)local_1c80._4_4_ * auVar25._4_4_ +
                                   auVar27._4_4_ * fVar194 + fVar187 * auVar26._4_4_;
                              local_1800._8_4_ =
                                   (float)local_1c80._4_4_ * auVar25._8_4_ +
                                   auVar27._8_4_ * fVar194 + fVar187 * auVar26._8_4_;
                              local_1800._12_4_ =
                                   (float)local_1c80._4_4_ * auVar25._12_4_ +
                                   auVar27._12_4_ * fVar194 + fVar187 * auVar26._12_4_;
                              local_1800._16_4_ =
                                   (float)local_1c80._4_4_ * auVar25._16_4_ +
                                   auVar27._16_4_ * fVar194 + fVar187 * auVar26._16_4_;
                              local_1800._20_4_ =
                                   (float)local_1c80._4_4_ * auVar25._20_4_ +
                                   auVar27._20_4_ * fVar194 + fVar187 * auVar26._20_4_;
                              local_1800._24_4_ =
                                   (float)local_1c80._4_4_ * auVar25._24_4_ +
                                   auVar27._24_4_ * fVar194 + fVar187 * auVar26._24_4_;
                              local_1800._28_4_ = auVar25._28_4_ + fVar174;
                              auVar25 = vsubps_avx(auVar96,auVar97);
                              fVar234 = auVar96._0_4_ + auVar97._0_4_;
                              fVar235 = auVar96._4_4_ + auVar97._4_4_;
                              fVar236 = auVar96._8_4_ + auVar97._8_4_;
                              fVar237 = auVar96._12_4_ + auVar97._12_4_;
                              fVar238 = auVar96._16_4_ + auVar97._16_4_;
                              fVar239 = auVar96._20_4_ + auVar97._20_4_;
                              fVar157 = auVar96._24_4_ + auVar97._24_4_;
                              auVar26 = vsubps_avx(auVar98,auVar23);
                              fVar226 = auVar98._0_4_ + auVar23._0_4_;
                              fVar227 = auVar98._4_4_ + auVar23._4_4_;
                              fVar228 = auVar98._8_4_ + auVar23._8_4_;
                              fVar229 = auVar98._12_4_ + auVar23._12_4_;
                              fVar230 = auVar98._16_4_ + auVar23._16_4_;
                              fVar231 = auVar98._20_4_ + auVar23._20_4_;
                              fVar232 = auVar98._24_4_ + auVar23._24_4_;
                              auVar27 = vsubps_avx(auVar121,auVar24);
                              fVar220 = auVar121._0_4_ + auVar24._0_4_;
                              fVar198 = auVar121._4_4_ + auVar24._4_4_;
                              fVar200 = auVar121._8_4_ + auVar24._8_4_;
                              fVar202 = auVar121._12_4_ + auVar24._12_4_;
                              fVar204 = auVar121._16_4_ + auVar24._16_4_;
                              fVar219 = auVar121._20_4_ + auVar24._20_4_;
                              fVar225 = auVar121._24_4_ + auVar24._24_4_;
                              fVar206 = auVar27._0_4_;
                              fVar213 = auVar27._4_4_;
                              auVar39._4_4_ = fVar213 * fVar227;
                              auVar39._0_4_ = fVar206 * fVar226;
                              fVar214 = auVar27._8_4_;
                              auVar39._8_4_ = fVar214 * fVar228;
                              fVar215 = auVar27._12_4_;
                              auVar39._12_4_ = fVar215 * fVar229;
                              fVar216 = auVar27._16_4_;
                              auVar39._16_4_ = fVar216 * fVar230;
                              fVar217 = auVar27._20_4_;
                              auVar39._20_4_ = fVar217 * fVar231;
                              fVar218 = auVar27._24_4_;
                              auVar39._24_4_ = fVar218 * fVar232;
                              auVar39._28_4_ = fVar196;
                              fVar243 = auVar26._0_4_;
                              fVar247 = auVar26._4_4_;
                              auVar40._4_4_ = fVar247 * fVar198;
                              auVar40._0_4_ = fVar243 * fVar220;
                              fVar250 = auVar26._8_4_;
                              auVar40._8_4_ = fVar250 * fVar200;
                              fVar253 = auVar26._12_4_;
                              auVar40._12_4_ = fVar253 * fVar202;
                              fVar256 = auVar26._16_4_;
                              auVar40._16_4_ = fVar256 * fVar204;
                              fVar259 = auVar26._20_4_;
                              auVar40._20_4_ = fVar259 * fVar219;
                              fVar262 = auVar26._24_4_;
                              auVar40._24_4_ = fVar262 * fVar225;
                              auVar40._28_4_ = fVar174;
                              auVar121 = vsubps_avx(auVar40,auVar39);
                              fVar188 = auVar25._0_4_;
                              fVar195 = auVar25._4_4_;
                              auVar41._4_4_ = fVar195 * fVar198;
                              auVar41._0_4_ = fVar188 * fVar220;
                              fVar197 = auVar25._8_4_;
                              auVar41._8_4_ = fVar197 * fVar200;
                              fVar199 = auVar25._12_4_;
                              auVar41._12_4_ = fVar199 * fVar202;
                              fVar201 = auVar25._16_4_;
                              auVar41._16_4_ = fVar201 * fVar204;
                              fVar203 = auVar25._20_4_;
                              auVar41._20_4_ = fVar203 * fVar219;
                              fVar205 = auVar25._24_4_;
                              auVar41._24_4_ = fVar205 * fVar225;
                              auVar41._28_4_ = fVar196 + auVar24._28_4_;
                              auVar24._4_4_ = fVar213 * fVar235;
                              auVar24._0_4_ = fVar206 * fVar234;
                              auVar24._8_4_ = fVar214 * fVar236;
                              auVar24._12_4_ = fVar215 * fVar237;
                              auVar24._16_4_ = fVar216 * fVar238;
                              auVar24._20_4_ = fVar217 * fVar239;
                              auVar24._24_4_ = fVar218 * fVar157;
                              auVar24._28_4_ = fVar174;
                              auVar24 = vsubps_avx(auVar24,auVar41);
                              auVar42._4_4_ = fVar247 * fVar235;
                              auVar42._0_4_ = fVar243 * fVar234;
                              auVar42._8_4_ = fVar250 * fVar236;
                              auVar42._12_4_ = fVar253 * fVar237;
                              auVar42._16_4_ = fVar256 * fVar238;
                              auVar42._20_4_ = fVar259 * fVar239;
                              auVar42._24_4_ = fVar262 * fVar157;
                              auVar42._28_4_ = auVar96._28_4_ + auVar97._28_4_;
                              auVar43._4_4_ = fVar195 * fVar227;
                              auVar43._0_4_ = fVar188 * fVar226;
                              auVar43._8_4_ = fVar197 * fVar228;
                              auVar43._12_4_ = fVar199 * fVar229;
                              auVar43._16_4_ = fVar201 * fVar230;
                              auVar43._20_4_ = fVar203 * fVar231;
                              auVar43._24_4_ = fVar205 * fVar232;
                              auVar43._28_4_ = auVar98._28_4_ + auVar23._28_4_;
                              auVar96 = vsubps_avx(auVar43,auVar42);
                              auVar110._0_4_ =
                                   (float)local_1c80._4_4_ * auVar121._0_4_ +
                                   auVar96._0_4_ * fVar194 + fVar187 * auVar24._0_4_;
                              auVar110._4_4_ =
                                   (float)local_1c80._4_4_ * auVar121._4_4_ +
                                   auVar96._4_4_ * fVar194 + fVar187 * auVar24._4_4_;
                              auVar110._8_4_ =
                                   (float)local_1c80._4_4_ * auVar121._8_4_ +
                                   auVar96._8_4_ * fVar194 + fVar187 * auVar24._8_4_;
                              auVar110._12_4_ =
                                   (float)local_1c80._4_4_ * auVar121._12_4_ +
                                   auVar96._12_4_ * fVar194 + fVar187 * auVar24._12_4_;
                              auVar110._16_4_ =
                                   (float)local_1c80._4_4_ * auVar121._16_4_ +
                                   auVar96._16_4_ * fVar194 + fVar187 * auVar24._16_4_;
                              auVar110._20_4_ =
                                   (float)local_1c80._4_4_ * auVar121._20_4_ +
                                   auVar96._20_4_ * fVar194 + fVar187 * auVar24._20_4_;
                              auVar110._24_4_ =
                                   (float)local_1c80._4_4_ * auVar121._24_4_ +
                                   auVar96._24_4_ * fVar194 + fVar187 * auVar24._24_4_;
                              auVar110._28_4_ = auVar96._28_4_ + auVar96._28_4_ + auVar24._28_4_;
                              local_1d60._0_4_ =
                                   auVar110._0_4_ + local_17e0._0_4_ + local_1800._0_4_;
                              local_1d60._4_4_ =
                                   auVar110._4_4_ + local_17e0._4_4_ + local_1800._4_4_;
                              local_1d60._8_4_ =
                                   auVar110._8_4_ + local_17e0._8_4_ + local_1800._8_4_;
                              local_1d60._12_4_ =
                                   auVar110._12_4_ + local_17e0._12_4_ + local_1800._12_4_;
                              local_1d60._16_4_ =
                                   auVar110._16_4_ + local_17e0._16_4_ + local_1800._16_4_;
                              local_1d60._20_4_ =
                                   auVar110._20_4_ + local_17e0._20_4_ + local_1800._20_4_;
                              local_1d60._24_4_ =
                                   auVar110._24_4_ + local_17e0._24_4_ + local_1800._24_4_;
                              local_1d60._28_4_ =
                                   auVar110._28_4_ + local_17e0._28_4_ + local_1800._28_4_;
                              auVar96 = vminps_avx(local_17e0,local_1800);
                              auVar96 = vminps_avx(auVar96,auVar110);
                              auVar150._8_4_ = 0x7fffffff;
                              auVar150._0_8_ = 0x7fffffff7fffffff;
                              auVar150._12_4_ = 0x7fffffff;
                              auVar150._16_4_ = 0x7fffffff;
                              auVar150._20_4_ = 0x7fffffff;
                              auVar150._24_4_ = 0x7fffffff;
                              auVar150._28_4_ = 0x7fffffff;
                              local_1860 = vandps_avx(local_1d60._0_32_,auVar150);
                              fVar220 = local_1860._0_4_ * 1.1920929e-07;
                              fVar196 = local_1860._4_4_ * 1.1920929e-07;
                              auVar23._4_4_ = fVar196;
                              auVar23._0_4_ = fVar220;
                              fVar198 = local_1860._8_4_ * 1.1920929e-07;
                              auVar23._8_4_ = fVar198;
                              fVar200 = local_1860._12_4_ * 1.1920929e-07;
                              auVar23._12_4_ = fVar200;
                              fVar202 = local_1860._16_4_ * 1.1920929e-07;
                              auVar23._16_4_ = fVar202;
                              fVar204 = local_1860._20_4_ * 1.1920929e-07;
                              auVar23._20_4_ = fVar204;
                              fVar219 = local_1860._24_4_ * 1.1920929e-07;
                              auVar23._24_4_ = fVar219;
                              auVar23._28_4_ = 0x34000000;
                              auVar171._0_8_ = CONCAT44(fVar196,fVar220) ^ 0x8000000080000000;
                              auVar171._8_4_ = -fVar198;
                              auVar171._12_4_ = -fVar200;
                              auVar171._16_4_ = -fVar202;
                              auVar171._20_4_ = -fVar204;
                              auVar171._24_4_ = -fVar219;
                              auVar171._28_4_ = 0xb4000000;
                              auVar96 = vcmpps_avx(auVar96,auVar171,5);
                              auVar97 = vmaxps_avx(local_17e0,local_1800);
                              auVar121 = vmaxps_avx(auVar97,auVar110);
                              auVar121 = vcmpps_avx(auVar121,auVar23,2);
                              auVar96 = vorps_avx(auVar96,auVar121);
                              local_1ca8 = lVar74;
                              local_1780 = auVar122;
                              if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar96 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar96 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar96 >> 0x7f,0) != '\0')
                                    || (auVar96 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB321(auVar96 >> 0xbf,0) != '\0')
                                  || (auVar96 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar96[0x1f] < '\0') {
                                auVar44._4_4_ = fVar279 * fVar19;
                                auVar44._0_4_ = fVar276 * fVar18;
                                auVar44._8_4_ = fVar281 * fVar20;
                                auVar44._12_4_ = fVar283 * fVar21;
                                auVar44._16_4_ = fVar285 * fVar22;
                                auVar44._20_4_ = fVar287 * fVar112;
                                auVar44._24_4_ = fVar289 * fVar124;
                                auVar44._28_4_ = auVar121._28_4_;
                                auVar45._4_4_ = fVar246 * fVar278;
                                auVar45._0_4_ = fVar242 * fVar275;
                                auVar45._8_4_ = fVar249 * fVar280;
                                auVar45._12_4_ = fVar252 * fVar282;
                                auVar45._16_4_ = fVar255 * fVar284;
                                auVar45._20_4_ = fVar258 * fVar286;
                                auVar45._24_4_ = fVar261 * fVar288;
                                auVar45._28_4_ = 0x34000000;
                                auVar98 = vsubps_avx(auVar45,auVar44);
                                auVar46._4_4_ = fVar247 * fVar246;
                                auVar46._0_4_ = fVar243 * fVar242;
                                auVar46._8_4_ = fVar250 * fVar249;
                                auVar46._12_4_ = fVar253 * fVar252;
                                auVar46._16_4_ = fVar256 * fVar255;
                                auVar46._20_4_ = fVar259 * fVar258;
                                auVar46._24_4_ = fVar262 * fVar261;
                                auVar46._28_4_ = auVar97._28_4_;
                                auVar47._4_4_ = fVar279 * fVar213;
                                auVar47._0_4_ = fVar276 * fVar206;
                                auVar47._8_4_ = fVar281 * fVar214;
                                auVar47._12_4_ = fVar283 * fVar215;
                                auVar47._16_4_ = fVar285 * fVar216;
                                auVar47._20_4_ = fVar287 * fVar217;
                                auVar47._24_4_ = fVar289 * fVar218;
                                auVar47._28_4_ = local_1800._28_4_;
                                auVar24 = vsubps_avx(auVar47,auVar46);
                                auVar224._8_4_ = 0x7fffffff;
                                auVar224._0_8_ = 0x7fffffff7fffffff;
                                auVar224._12_4_ = 0x7fffffff;
                                auVar224._16_4_ = 0x7fffffff;
                                auVar224._20_4_ = 0x7fffffff;
                                auVar224._24_4_ = 0x7fffffff;
                                auVar224._28_4_ = 0x7fffffff;
                                auVar121 = vandps_avx(auVar224,auVar44);
                                auVar97 = vandps_avx(auVar224,auVar46);
                                auVar121 = vcmpps_avx(auVar121,auVar97,1);
                                auVar23 = vblendvps_avx(auVar24,auVar98,auVar121);
                                auVar48._4_4_ = fVar269 * fVar213;
                                auVar48._0_4_ = fVar266 * fVar206;
                                auVar48._8_4_ = fVar270 * fVar214;
                                auVar48._12_4_ = fVar271 * fVar215;
                                auVar48._16_4_ = fVar272 * fVar216;
                                auVar48._20_4_ = fVar273 * fVar217;
                                auVar48._24_4_ = fVar274 * fVar218;
                                auVar48._28_4_ = auVar98._28_4_;
                                auVar49._4_4_ = fVar269 * fVar19;
                                auVar49._0_4_ = fVar266 * fVar18;
                                auVar49._8_4_ = fVar270 * fVar20;
                                auVar49._12_4_ = fVar271 * fVar21;
                                auVar49._16_4_ = fVar272 * fVar22;
                                auVar49._20_4_ = fVar273 * fVar112;
                                auVar49._24_4_ = fVar274 * fVar124;
                                auVar49._28_4_ = auVar97._28_4_;
                                auVar50._4_4_ = fVar245 * fVar246;
                                auVar50._0_4_ = fVar241 * fVar242;
                                auVar50._8_4_ = fVar248 * fVar249;
                                auVar50._12_4_ = fVar251 * fVar252;
                                auVar50._16_4_ = fVar254 * fVar255;
                                auVar50._20_4_ = fVar257 * fVar258;
                                auVar50._24_4_ = fVar260 * fVar261;
                                auVar50._28_4_ = auVar24._28_4_;
                                auVar24 = vsubps_avx(auVar49,auVar50);
                                auVar51._4_4_ = fVar246 * fVar195;
                                auVar51._0_4_ = fVar242 * fVar188;
                                auVar51._8_4_ = fVar249 * fVar197;
                                auVar51._12_4_ = fVar252 * fVar199;
                                auVar51._16_4_ = fVar255 * fVar201;
                                auVar51._20_4_ = fVar258 * fVar203;
                                auVar51._24_4_ = fVar261 * fVar205;
                                auVar51._28_4_ = auVar27._28_4_;
                                auVar98 = vsubps_avx(auVar51,auVar48);
                                auVar121 = vandps_avx(auVar224,auVar50);
                                auVar97 = vandps_avx(auVar224,auVar48);
                                auVar97 = vcmpps_avx(auVar121,auVar97,1);
                                auVar98 = vblendvps_avx(auVar98,auVar24,auVar97);
                                auVar52._4_4_ = fVar279 * fVar195;
                                auVar52._0_4_ = fVar276 * fVar188;
                                auVar52._8_4_ = fVar281 * fVar197;
                                auVar52._12_4_ = fVar283 * fVar199;
                                auVar52._16_4_ = fVar285 * fVar201;
                                auVar52._20_4_ = fVar287 * fVar203;
                                auVar52._24_4_ = fVar289 * fVar205;
                                auVar52._28_4_ = auVar97._28_4_;
                                auVar53._4_4_ = fVar245 * fVar279;
                                auVar53._0_4_ = fVar241 * fVar276;
                                auVar53._8_4_ = fVar248 * fVar281;
                                auVar53._12_4_ = fVar251 * fVar283;
                                auVar53._16_4_ = fVar254 * fVar285;
                                auVar53._20_4_ = fVar257 * fVar287;
                                auVar53._24_4_ = fVar260 * fVar289;
                                auVar53._28_4_ = auVar24._28_4_;
                                auVar54._4_4_ = fVar269 * fVar278;
                                auVar54._0_4_ = fVar266 * fVar275;
                                auVar54._8_4_ = fVar270 * fVar280;
                                auVar54._12_4_ = fVar271 * fVar282;
                                auVar54._16_4_ = fVar272 * fVar284;
                                auVar54._20_4_ = fVar273 * fVar286;
                                auVar54._24_4_ = fVar274 * fVar288;
                                auVar54._28_4_ = auVar121._28_4_;
                                auVar55._4_4_ = fVar269 * fVar247;
                                auVar55._0_4_ = fVar266 * fVar243;
                                auVar55._8_4_ = fVar270 * fVar250;
                                auVar55._12_4_ = fVar271 * fVar253;
                                auVar55._16_4_ = fVar272 * fVar256;
                                auVar55._20_4_ = fVar273 * fVar259;
                                auVar55._24_4_ = fVar274 * fVar262;
                                auVar55._28_4_ = local_1780._28_4_;
                                auVar24 = vsubps_avx(auVar53,auVar54);
                                auVar27 = vsubps_avx(auVar55,auVar52);
                                auVar121 = vandps_avx(auVar224,auVar54);
                                auVar97 = vandps_avx(auVar224,auVar52);
                                auVar97 = vcmpps_avx(auVar121,auVar97,1);
                                auVar97 = vblendvps_avx(auVar27,auVar24,auVar97);
                                auVar123 = ZEXT3264(auVar97);
                                auVar87 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
                                fVar112 = auVar97._0_4_;
                                fVar124 = auVar97._4_4_;
                                fVar198 = auVar97._8_4_;
                                fVar200 = auVar97._12_4_;
                                fVar202 = auVar97._16_4_;
                                fVar204 = auVar97._20_4_;
                                fVar219 = auVar97._24_4_;
                                fVar231 = auVar98._0_4_;
                                fVar232 = auVar98._4_4_;
                                fVar234 = auVar98._8_4_;
                                fVar235 = auVar98._12_4_;
                                fVar236 = auVar98._16_4_;
                                fVar237 = auVar98._20_4_;
                                fVar238 = auVar98._24_4_;
                                fVar220 = auVar23._0_4_;
                                fVar196 = auVar23._4_4_;
                                fVar18 = auVar23._8_4_;
                                fVar19 = auVar23._12_4_;
                                fVar20 = auVar23._16_4_;
                                fVar21 = auVar23._20_4_;
                                fVar22 = auVar23._24_4_;
                                fVar225 = (float)local_1c80._4_4_ * fVar220 +
                                          fVar112 * fVar194 + fVar231 * fVar187;
                                fVar226 = (float)local_1c80._4_4_ * fVar196 +
                                          fVar124 * fVar194 + fVar232 * fVar187;
                                fVar227 = (float)local_1c80._4_4_ * fVar18 +
                                          fVar198 * fVar194 + fVar234 * fVar187;
                                fVar228 = (float)local_1c80._4_4_ * fVar19 +
                                          fVar200 * fVar194 + fVar235 * fVar187;
                                fVar229 = (float)local_1c80._4_4_ * fVar20 +
                                          fVar202 * fVar194 + fVar236 * fVar187;
                                fVar230 = (float)local_1c80._4_4_ * fVar21 +
                                          fVar204 * fVar194 + fVar237 * fVar187;
                                fVar187 = (float)local_1c80._4_4_ * fVar22 +
                                          fVar219 * fVar194 + fVar238 * fVar187;
                                fVar194 = auVar96._28_4_ + 0.0 + 0.0;
                                auVar138._0_4_ = fVar225 + fVar225;
                                auVar138._4_4_ = fVar226 + fVar226;
                                auVar138._8_4_ = fVar227 + fVar227;
                                auVar138._12_4_ = fVar228 + fVar228;
                                auVar138._16_4_ = fVar229 + fVar229;
                                auVar138._20_4_ = fVar230 + fVar230;
                                auVar138._24_4_ = fVar187 + fVar187;
                                auVar138._28_4_ = fVar194 + fVar194;
                                fVar225 = fVar220 * fVar127 + fVar112 * fVar126 + fVar231 * fVar125;
                                fVar152 = fVar196 * fVar152 + fVar124 * fVar129 + fVar232 * fVar128;
                                fVar153 = fVar18 * fVar155 + fVar198 * fVar154 + fVar234 * fVar153;
                                fVar154 = fVar19 * fVar159 + fVar200 * fVar158 + fVar235 * fVar156;
                                fVar155 = fVar20 * fVar11 + fVar202 * fVar10 + fVar236 * fVar9;
                                fVar156 = fVar21 * fVar14 + fVar204 * fVar13 + fVar237 * fVar12;
                                fVar158 = fVar22 * fVar17 + fVar219 * fVar16 + fVar238 * fVar15;
                                fVar159 = auVar121._28_4_ + auVar121._28_4_ + 0.0;
                                auVar96 = vrcpps_avx(auVar138);
                                fVar187 = auVar96._0_4_;
                                fVar194 = auVar96._4_4_;
                                auVar56._4_4_ = auVar138._4_4_ * fVar194;
                                auVar56._0_4_ = auVar138._0_4_ * fVar187;
                                fVar125 = auVar96._8_4_;
                                auVar56._8_4_ = auVar138._8_4_ * fVar125;
                                fVar126 = auVar96._12_4_;
                                auVar56._12_4_ = auVar138._12_4_ * fVar126;
                                fVar127 = auVar96._16_4_;
                                auVar56._16_4_ = auVar138._16_4_ * fVar127;
                                fVar128 = auVar96._20_4_;
                                auVar56._20_4_ = auVar138._20_4_ * fVar128;
                                fVar129 = auVar96._24_4_;
                                auVar56._24_4_ = auVar138._24_4_ * fVar129;
                                auVar56._28_4_ = auVar25._28_4_;
                                auVar211._8_4_ = 0x3f800000;
                                auVar211._0_8_ = 0x3f8000003f800000;
                                auVar211._12_4_ = 0x3f800000;
                                auVar211._16_4_ = 0x3f800000;
                                auVar211._20_4_ = 0x3f800000;
                                auVar211._24_4_ = 0x3f800000;
                                auVar211._28_4_ = 0x3f800000;
                                auVar96 = vsubps_avx(auVar211,auVar56);
                                auVar57._4_4_ =
                                     (fVar152 + fVar152) * (fVar194 + fVar194 * auVar96._4_4_);
                                auVar57._0_4_ =
                                     (fVar225 + fVar225) * (fVar187 + fVar187 * auVar96._0_4_);
                                auVar57._8_4_ =
                                     (fVar153 + fVar153) * (fVar125 + fVar125 * auVar96._8_4_);
                                auVar57._12_4_ =
                                     (fVar154 + fVar154) * (fVar126 + fVar126 * auVar96._12_4_);
                                auVar57._16_4_ =
                                     (fVar155 + fVar155) * (fVar127 + fVar127 * auVar96._16_4_);
                                auVar57._20_4_ =
                                     (fVar156 + fVar156) * (fVar128 + fVar128 * auVar96._20_4_);
                                auVar57._24_4_ =
                                     (fVar158 + fVar158) * (fVar129 + fVar129 * auVar96._24_4_);
                                auVar57._28_4_ = fVar159 + fVar159;
                                uVar68 = *(undefined4 *)(local_1dd8 + lVar74 * 4 + 0x30);
                                auVar185._4_4_ = uVar68;
                                auVar185._0_4_ = uVar68;
                                auVar185._8_4_ = uVar68;
                                auVar185._12_4_ = uVar68;
                                auVar185._16_4_ = uVar68;
                                auVar185._20_4_ = uVar68;
                                auVar185._24_4_ = uVar68;
                                auVar185._28_4_ = uVar68;
                                auVar96 = vcmpps_avx(auVar185,auVar57,2);
                                uVar68 = *(undefined4 *)(local_1dd8 + lVar74 * 4 + 0x80);
                                auVar212._4_4_ = uVar68;
                                auVar212._0_4_ = uVar68;
                                auVar212._8_4_ = uVar68;
                                auVar212._12_4_ = uVar68;
                                auVar212._16_4_ = uVar68;
                                auVar212._20_4_ = uVar68;
                                auVar212._24_4_ = uVar68;
                                auVar212._28_4_ = uVar68;
                                auVar111 = ZEXT3264(auVar212);
                                auVar121 = vcmpps_avx(auVar57,auVar212,2);
                                auVar96 = vandps_avx(auVar121,auVar96);
                                auVar113 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
                                auVar87 = vpand_avx(auVar113,auVar87);
                                auVar113 = vpmovsxwd_avx(auVar87);
                                auVar139 = vpshufd_avx(auVar87,0xee);
                                auVar139 = vpmovsxwd_avx(auVar139);
                                auVar186._16_16_ = auVar139;
                                auVar186._0_16_ = auVar113;
                                auVar98 = local_1d60._0_32_;
                                if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar186 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar186 >> 0x5f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) || SUB321(auVar186 >> 0x7f,0) != '\0'
                                       ) || (auVar186 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) ||
                                     SUB161(auVar139 >> 0x3f,0) != '\0') ||
                                    (auVar186 & (undefined1  [32])0x100000000) !=
                                    (undefined1  [32])0x0) || auVar139[0xf] < '\0') {
                                  auVar96 = vcmpps_avx(auVar138,_DAT_01faff00,4);
                                  auVar113 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
                                  auVar87 = vpand_avx(auVar87,auVar113);
                                  auVar113 = vpmovsxwd_avx(auVar87);
                                  auVar139 = vpunpckhwd_avx(auVar87,auVar87);
                                  auVar172._16_16_ = auVar139;
                                  auVar172._0_16_ = auVar113;
                                  if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar172 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar172 >> 0x5f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         SUB321(auVar172 >> 0x7f,0) != '\0') ||
                                        (auVar172 & (undefined1  [32])0x100000000) !=
                                        (undefined1  [32])0x0) || SUB161(auVar139 >> 0x3f,0) != '\0'
                                       ) || (auVar172 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) || auVar139[0xf] < '\0') {
                                    local_19c0 = local_1d60._0_32_;
                                    local_19a0 = &local_1de9;
                                    local_1980 = auVar172;
                                    local_1920 = auVar57;
                                    auVar96 = vsubps_avx(local_1d60._0_32_,local_1800);
                                    auVar96 = vblendvps_avx(local_17e0,auVar96,local_1880);
                                    auVar121 = vsubps_avx(local_1d60._0_32_,local_17e0);
                                    uStack_18e4 = auVar23._28_4_;
                                    local_1900[0] = (float)local_18a0._0_4_ * fVar220;
                                    local_1900[1] = (float)local_18a0._4_4_ * fVar196;
                                    local_1900[2] = fStack_1898 * fVar18;
                                    local_1900[3] = fStack_1894 * fVar19;
                                    fStack_18f0 = fStack_1890 * fVar20;
                                    fStack_18ec = fStack_188c * fVar21;
                                    fStack_18e8 = fStack_1888 * fVar22;
                                    local_18e0[0] = fVar231 * (float)local_18a0._0_4_;
                                    local_18e0[1] = fVar232 * (float)local_18a0._4_4_;
                                    local_18e0[2] = fVar234 * fStack_1898;
                                    local_18e0[3] = fVar235 * fStack_1894;
                                    fStack_18d0 = fVar236 * fStack_1890;
                                    fStack_18cc = fVar237 * fStack_188c;
                                    fStack_18c8 = fVar238 * fStack_1888;
                                    uStack_18c4 = uStack_18e4;
                                    local_18c0[0] = (float)local_18a0._0_4_ * fVar112;
                                    local_18c0[1] = (float)local_18a0._4_4_ * fVar124;
                                    local_18c0[2] = fStack_1898 * fVar198;
                                    local_18c0[3] = fStack_1894 * fVar200;
                                    fStack_18b0 = fStack_1890 * fVar202;
                                    fStack_18ac = fStack_188c * fVar204;
                                    fStack_18a8 = fStack_1888 * fVar219;
                                    uStack_18a4 = uStack_18e4;
                                    auVar106._0_4_ =
                                         (float)(int)(*(ushort *)(local_1cb8 + 8 + local_1cc0) - 1);
                                    auVar106._4_12_ = auVar26._4_12_;
                                    auVar121 = vblendvps_avx(local_1800,auVar121,local_1880);
                                    auVar113 = vrcpss_avx(auVar106,auVar106);
                                    auVar170._0_4_ =
                                         (float)(int)(*(ushort *)(local_1cb8 + 10 + local_1cc0) - 1)
                                    ;
                                    auVar170._4_12_ = auVar26._4_12_;
                                    auVar139 = vrcpss_avx(auVar170,auVar170);
                                    auVar113 = ZEXT416((uint)(auVar113._0_4_ *
                                                             (2.0 - auVar113._0_4_ * auVar106._0_4_)
                                                             ));
                                    auVar113 = vshufps_avx(auVar113,auVar113,0);
                                    local_1a00[0] =
                                         (local_1d60._0_4_ * (float)local_1820._0_4_ + auVar96._0_4_
                                         ) * auVar113._0_4_;
                                    local_1a00[1] =
                                         (local_1d60._4_4_ * (float)local_1820._4_4_ + auVar96._4_4_
                                         ) * auVar113._4_4_;
                                    local_1a00[2] =
                                         (local_1d60._8_4_ * fStack_1818 + auVar96._8_4_) *
                                         auVar113._8_4_;
                                    fStack_19e4 = auVar113._12_4_;
                                    local_1a00[3] =
                                         (local_1d60._12_4_ * fStack_1814 + auVar96._12_4_) *
                                         fStack_19e4;
                                    fStack_19f0 = (local_1d60._16_4_ * fStack_1810 + auVar96._16_4_)
                                                  * auVar113._0_4_;
                                    fStack_19ec = (local_1d60._20_4_ * fStack_180c + auVar96._20_4_)
                                                  * auVar113._4_4_;
                                    fStack_19e8 = (local_1d60._24_4_ * fStack_1808 + auVar96._24_4_)
                                                  * auVar113._8_4_;
                                    auVar113 = ZEXT416((uint)(auVar139._0_4_ *
                                                             (2.0 - auVar139._0_4_ * auVar170._0_4_)
                                                             ));
                                    auVar113 = vshufps_avx(auVar113,auVar113,0);
                                    fVar187 = (local_1d60._0_4_ * (float)local_1840._0_4_ +
                                              auVar121._0_4_) * auVar113._0_4_;
                                    fVar194 = (local_1d60._4_4_ * (float)local_1840._4_4_ +
                                              auVar121._4_4_) * auVar113._4_4_;
                                    local_19e0._4_4_ = fVar194;
                                    local_19e0._0_4_ = fVar187;
                                    fVar125 = (local_1d60._8_4_ * fStack_1838 + auVar121._8_4_) *
                                              auVar113._8_4_;
                                    local_19e0._8_4_ = fVar125;
                                    fVar126 = (local_1d60._12_4_ * fStack_1834 + auVar121._12_4_) *
                                              auVar113._12_4_;
                                    local_19e0._12_4_ = fVar126;
                                    fVar127 = (local_1d60._16_4_ * fStack_1830 + auVar121._16_4_) *
                                              auVar113._0_4_;
                                    local_19e0._16_4_ = fVar127;
                                    fVar128 = (local_1d60._20_4_ * fStack_182c + auVar121._20_4_) *
                                              auVar113._4_4_;
                                    local_19e0._20_4_ = fVar128;
                                    fVar129 = (local_1d60._24_4_ * fStack_1828 + auVar121._24_4_) *
                                              auVar113._8_4_;
                                    local_19e0._24_4_ = fVar129;
                                    local_19e0._28_4_ = auVar96._28_4_ + 0.0 + auVar121._28_4_;
                                    auVar123 = ZEXT3264(local_19e0);
                                    pGVar77 = (local_1cb0->geometries).items[uVar67].ptr;
                                    if ((pGVar77->mask & *(uint *)(local_1dd8 + lVar74 * 4 + 0x90))
                                        != 0) {
                                      if ((local_1cd8->args->filter == (RTCFilterFunctionN)0x0) &&
                                         (pGVar77->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0030b271:
                                        *(undefined4 *)(local_1c50 + lVar74 * 4) = 0;
                                        auVar98 = local_1d60._0_32_;
                                      }
                                      else {
                                        auVar96 = vrcpps_avx(local_1d60._0_32_);
                                        fVar152 = auVar96._0_4_;
                                        fVar153 = auVar96._4_4_;
                                        auVar58._4_4_ = local_1d60._4_4_ * fVar153;
                                        auVar58._0_4_ = local_1d60._0_4_ * fVar152;
                                        fVar154 = auVar96._8_4_;
                                        auVar58._8_4_ = local_1d60._8_4_ * fVar154;
                                        fVar155 = auVar96._12_4_;
                                        auVar58._12_4_ = local_1d60._12_4_ * fVar155;
                                        fVar156 = auVar96._16_4_;
                                        auVar58._16_4_ = local_1d60._16_4_ * fVar156;
                                        fVar158 = auVar96._20_4_;
                                        auVar58._20_4_ = local_1d60._20_4_ * fVar158;
                                        fVar159 = auVar96._24_4_;
                                        auVar58._24_4_ = local_1d60._24_4_ * fVar159;
                                        auVar58._28_4_ = local_1d60._28_4_;
                                        auVar173._8_4_ = 0x3f800000;
                                        auVar173._0_8_ = 0x3f8000003f800000;
                                        auVar173._12_4_ = 0x3f800000;
                                        auVar173._16_4_ = 0x3f800000;
                                        auVar173._20_4_ = 0x3f800000;
                                        auVar173._24_4_ = 0x3f800000;
                                        auVar173._28_4_ = 0x3f800000;
                                        auVar121 = vsubps_avx(auVar173,auVar58);
                                        auVar99._0_4_ = fVar152 + fVar152 * auVar121._0_4_;
                                        auVar99._4_4_ = fVar153 + fVar153 * auVar121._4_4_;
                                        auVar99._8_4_ = fVar154 + fVar154 * auVar121._8_4_;
                                        auVar99._12_4_ = fVar155 + fVar155 * auVar121._12_4_;
                                        auVar99._16_4_ = fVar156 + fVar156 * auVar121._16_4_;
                                        auVar99._20_4_ = fVar158 + fVar158 * auVar121._20_4_;
                                        auVar99._24_4_ = fVar159 + fVar159 * auVar121._24_4_;
                                        auVar99._28_4_ = auVar96._28_4_ + auVar121._28_4_;
                                        auVar151._8_4_ = 0x219392ef;
                                        auVar151._0_8_ = 0x219392ef219392ef;
                                        auVar151._12_4_ = 0x219392ef;
                                        auVar151._16_4_ = 0x219392ef;
                                        auVar151._20_4_ = 0x219392ef;
                                        auVar151._24_4_ = 0x219392ef;
                                        auVar151._28_4_ = 0x219392ef;
                                        auVar96 = vcmpps_avx(local_1860,auVar151,5);
                                        auVar96 = vandps_avx(auVar96,auVar99);
                                        auVar59._4_4_ = local_1a00[1] * auVar96._4_4_;
                                        auVar59._0_4_ = local_1a00[0] * auVar96._0_4_;
                                        auVar59._8_4_ = local_1a00[2] * auVar96._8_4_;
                                        auVar59._12_4_ = local_1a00[3] * auVar96._12_4_;
                                        auVar59._16_4_ = fStack_19f0 * auVar96._16_4_;
                                        auVar59._20_4_ = fStack_19ec * auVar96._20_4_;
                                        auVar59._24_4_ = fStack_19e8 * auVar96._24_4_;
                                        auVar59._28_4_ = fStack_19e4;
                                        local_1960 = vminps_avx(auVar59,auVar173);
                                        auVar60._4_4_ = fVar194 * auVar96._4_4_;
                                        auVar60._0_4_ = fVar187 * auVar96._0_4_;
                                        auVar60._8_4_ = fVar125 * auVar96._8_4_;
                                        auVar60._12_4_ = fVar126 * auVar96._12_4_;
                                        auVar60._16_4_ = fVar127 * auVar96._16_4_;
                                        auVar60._20_4_ = fVar128 * auVar96._20_4_;
                                        auVar60._24_4_ = fVar129 * auVar96._24_4_;
                                        auVar60._28_4_ = auVar96._28_4_;
                                        local_1940 = vminps_avx(auVar60,auVar173);
                                        auVar87 = vpacksswb_avx(auVar87,auVar87);
                                        bVar29 = SUB161(auVar87 >> 7,0) & 1 |
                                                 (SUB161(auVar87 >> 0xf,0) & 1) << 1 |
                                                 (SUB161(auVar87 >> 0x17,0) & 1) << 2 |
                                                 (SUB161(auVar87 >> 0x1f,0) & 1) << 3 |
                                                 (SUB161(auVar87 >> 0x27,0) & 1) << 4 |
                                                 (SUB161(auVar87 >> 0x2f,0) & 1) << 5 |
                                                 (SUB161(auVar87 >> 0x37,0) & 1) << 6 |
                                                 SUB161(auVar87 >> 0x3f,0) << 7;
                                        uVar76 = (ulong)bVar29;
                                        uVar71 = 0;
                                        if (uVar76 != 0) {
                                          for (; (bVar29 >> uVar71 & 1) == 0; uVar71 = uVar71 + 1) {
                                          }
                                        }
                                        if (bVar29 != 0) {
                                          local_1d60._0_16_ =
                                               *(undefined1 (*) [16])
                                                (mm_lookupmask_ps +
                                                (long)(1 << ((byte)lVar74 & 0x1f)) * 0x10);
                                          local_1ca0._0_8_ = pGVar77;
                                          _local_1c80 = auVar212;
                                          do {
                                            local_1b00 = *(undefined4 *)(local_1960 + uVar71 * 4);
                                            uVar68 = *(undefined4 *)(local_1940 + uVar71 * 4);
                                            local_1af0._4_4_ = uVar68;
                                            local_1af0._0_4_ = uVar68;
                                            local_1af0._8_4_ = uVar68;
                                            local_1af0._12_4_ = uVar68;
                                            auVar123 = ZEXT1664(local_1af0);
                                            *(float *)(ray + lVar74 * 4 + 0x80) =
                                                 local_1900[uVar71 - 8];
                                            local_1c40.context = context->user;
                                            local_1b30[0] = local_1900[uVar71];
                                            fVar187 = local_18e0[uVar71];
                                            local_1b20._4_4_ = fVar187;
                                            local_1b20._0_4_ = fVar187;
                                            local_1b20._8_4_ = fVar187;
                                            local_1b20._12_4_ = fVar187;
                                            fVar187 = local_18c0[uVar71];
                                            local_1b10._4_4_ = fVar187;
                                            local_1b10._0_4_ = fVar187;
                                            local_1b10._8_4_ = fVar187;
                                            local_1b10._12_4_ = fVar187;
                                            local_1b30[1] = local_1b30[0];
                                            local_1b30[2] = local_1b30[0];
                                            local_1b30[3] = local_1b30[0];
                                            uStack_1afc = local_1b00;
                                            uStack_1af8 = local_1b00;
                                            uStack_1af4 = local_1b00;
                                            local_1ae0 = local_1a50._0_8_;
                                            uStack_1ad8 = local_1a50._8_8_;
                                            local_1ad0 = local_1a40;
                                            vcmpps_avx(ZEXT1632(local_1a40),ZEXT1632(local_1a40),0xf
                                                      );
                                            uStack_1abc = (local_1c40.context)->instID[0];
                                            local_1ac0 = uStack_1abc;
                                            uStack_1ab8 = uStack_1abc;
                                            uStack_1ab4 = uStack_1abc;
                                            uStack_1ab0 = (local_1c40.context)->instPrimID[0];
                                            uStack_1aac = uStack_1ab0;
                                            uStack_1aa8 = uStack_1ab0;
                                            uStack_1aa4 = uStack_1ab0;
                                            local_1d20 = local_1d60._0_16_;
                                            local_1c40.valid = (int *)local_1d20;
                                            local_1c40.geometryUserPtr = pGVar77->userPtr;
                                            local_1c40.ray = (RTCRayN *)ray;
                                            local_1c40.hit = (RTCHitN *)local_1b30;
                                            local_1c40.N = 4;
                                            local_1d80._0_8_ = uVar76;
                                            local_1da0._0_8_ = uVar71;
                                            if (pGVar77->occlusionFilterN != (RTCFilterFunctionN)0x0
                                               ) {
                                              auVar123 = ZEXT1664(local_1af0);
                                              (*pGVar77->occlusionFilterN)(&local_1c40);
                                              auVar111 = ZEXT3264(_local_1c80);
                                              pGVar77 = (Geometry *)local_1ca0._0_8_;
                                              uVar76 = local_1d80._0_8_;
                                              uVar71 = local_1da0._0_8_;
                                            }
                                            if (local_1d20 == (undefined1  [16])0x0) {
                                              auVar87 = vpcmpeqd_avx((undefined1  [16])0x0,
                                                                     _DAT_01f7aa10);
                                              auVar87 = auVar87 ^ _DAT_01f7ae20;
                                            }
                                            else {
                                              p_Var8 = context->args->filter;
                                              if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                                 (((context->args->flags &
                                                   RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                                   RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                                  (((pGVar77->field_8).field_0x2 & 0x40) != 0)))) {
                                                (*p_Var8)(&local_1c40);
                                                auVar111 = ZEXT3264(_local_1c80);
                                                pGVar77 = (Geometry *)local_1ca0._0_8_;
                                                uVar76 = local_1d80._0_8_;
                                                uVar71 = local_1da0._0_8_;
                                              }
                                              auVar113 = vpcmpeqd_avx(local_1d20,_DAT_01f7aa10);
                                              auVar87 = auVar113 ^ _DAT_01f7ae20;
                                              auVar119._8_4_ = 0xff800000;
                                              auVar119._0_8_ = 0xff800000ff800000;
                                              auVar119._12_4_ = 0xff800000;
                                              auVar123 = ZEXT1664(auVar119);
                                              auVar113 = vblendvps_avx(auVar119,*(undefined1
                                                                                  (*) [16])
                                                                                 (local_1c40.ray +
                                                                                 0x80),auVar113);
                                              *(undefined1 (*) [16])(local_1c40.ray + 0x80) =
                                                   auVar113;
                                            }
                                            auVar107._8_8_ = 0x100000001;
                                            auVar107._0_8_ = 0x100000001;
                                            if ((auVar107 & auVar87) != (undefined1  [16])0x0)
                                            goto LAB_0030b271;
                                            *(int *)(local_1da8 + lVar74 * 4) = auVar111._0_4_;
                                            uVar76 = uVar76 ^ 1L << (uVar71 & 0x3f);
                                            uVar71 = 0;
                                            if (uVar76 != 0) {
                                              for (; (uVar76 >> uVar71 & 1) == 0;
                                                  uVar71 = uVar71 + 1) {
                                              }
                                            }
                                            auVar98 = local_1d60._0_32_;
                                          } while (uVar76 != 0);
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                              local_1d60._0_32_ = auVar98;
                              uVar76 = local_1d30._0_8_ & local_1d30._0_8_ - 1;
                              pRVar82 = ray;
                              pRVar83 = context;
                            } while (uVar76 != 0);
                            auVar265 = ZEXT1664(local_1a60);
                            uVar71 = local_1ce0;
                            lVar74 = local_1ce8;
                            puVar79 = local_1de0;
                            pauVar80 = local_1de8;
                            auVar87 = local_1a30;
                          }
                          auVar113 = auVar87 & local_1c50;
                          bVar85 = (((auVar113 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0 &&
                                    (auVar113 >> 0x3f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar113 >> 0x5f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) && -1 < auVar113[0xf];
                          auVar87 = vandps_avx(auVar87,local_1c50);
                          auVar111 = ZEXT1664(auVar87);
                        }
                      } while ((!bVar85) && (uVar71 = uVar71 & uVar71 - 1, uVar71 != 0));
                    }
                    lVar74 = local_1cf0 + 1;
                  } while (lVar74 != local_1cf8);
                  auVar87 = vpcmpeqd_avx(auVar123._0_16_,auVar123._0_16_);
                  auVar108._0_4_ = auVar111._0_4_ ^ auVar87._0_4_;
                  auVar108._4_4_ = auVar111._4_4_ ^ auVar87._4_4_;
                  auVar108._8_4_ = auVar111._8_4_ ^ auVar87._8_4_;
                  auVar108._12_4_ = auVar111._12_4_ ^ auVar87._12_4_;
                }
                local_1dc0 = vorps_avx(local_1dc0,auVar108);
                auVar87 = auVar87 & ~local_1dc0;
                if ((((auVar87 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar87 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar87 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar87[0xf]) goto LAB_0030b741;
                auVar120._8_4_ = 0xff800000;
                auVar120._0_8_ = 0xff800000ff800000;
                auVar120._12_4_ = 0xff800000;
                auVar87 = vblendvps_avx(local_1b40,auVar120,local_1dc0);
                auVar113 = vpcmpeqd_avx(local_1b40,local_1b40);
                auVar111 = ZEXT1664(auVar113);
                local_1b40 = auVar87;
              }
              goto LAB_0030a17e;
            }
            uVar71 = root.ptr & 0xfffffffffffffff0;
            auVar87 = vcmpps_avx(local_1b40,auVar87,6);
            auVar101._8_4_ = 0x7f800000;
            auVar101._0_8_ = 0x7f8000007f800000;
            auVar101._12_4_ = 0x7f800000;
            uVar78 = 8;
            do {
              root.ptr = *(ulong *)(uVar71 + 0x20 + lVar74 * 2);
              if (root.ptr == 8) {
                auVar123 = ZEXT1664(auVar101);
                root.ptr = uVar78;
                break;
              }
              fVar187 = *(float *)(uVar71 + 0x90 + lVar74);
              fVar194 = *(float *)(uVar71 + 0x30 + lVar74);
              auVar113 = *(undefined1 (*) [16])(ray + 0x70);
              fVar125 = auVar113._0_4_;
              fVar126 = auVar113._4_4_;
              fVar127 = auVar113._8_4_;
              fVar128 = auVar113._12_4_;
              auVar130._0_4_ = fVar125 * fVar187 + fVar194;
              auVar130._4_4_ = fVar126 * fVar187 + fVar194;
              auVar130._8_4_ = fVar127 * fVar187 + fVar194;
              auVar130._12_4_ = fVar128 * fVar187 + fVar194;
              fVar187 = *(float *)(uVar71 + 0xb0 + lVar74);
              fVar194 = *(float *)(uVar71 + 0x50 + lVar74);
              auVar141._0_4_ = fVar125 * fVar187 + fVar194;
              auVar141._4_4_ = fVar126 * fVar187 + fVar194;
              auVar141._8_4_ = fVar127 * fVar187 + fVar194;
              auVar141._12_4_ = fVar128 * fVar187 + fVar194;
              fVar187 = *(float *)(uVar71 + 0xd0 + lVar74);
              fVar194 = *(float *)(uVar71 + 0x70 + lVar74);
              auVar161._0_4_ = fVar125 * fVar187 + fVar194;
              auVar161._4_4_ = fVar126 * fVar187 + fVar194;
              auVar161._8_4_ = fVar127 * fVar187 + fVar194;
              auVar161._12_4_ = fVar128 * fVar187 + fVar194;
              fVar187 = *(float *)(uVar71 + 0xa0 + lVar74);
              fVar194 = *(float *)(uVar71 + 0x40 + lVar74);
              auVar178._0_4_ = fVar125 * fVar187 + fVar194;
              auVar178._4_4_ = fVar126 * fVar187 + fVar194;
              auVar178._8_4_ = fVar127 * fVar187 + fVar194;
              auVar178._12_4_ = fVar128 * fVar187 + fVar194;
              fVar187 = *(float *)(uVar71 + 0xc0 + lVar74);
              fVar194 = *(float *)(uVar71 + 0x60 + lVar74);
              auVar189._0_4_ = fVar194 + fVar125 * fVar187;
              auVar189._4_4_ = fVar194 + fVar126 * fVar187;
              auVar189._8_4_ = fVar194 + fVar127 * fVar187;
              auVar189._12_4_ = fVar194 + fVar128 * fVar187;
              fVar187 = *(float *)(uVar71 + 0xe0 + lVar74);
              fVar194 = *(float *)(uVar71 + 0x80 + lVar74);
              auVar209._0_4_ = fVar187 * fVar125 + fVar194;
              auVar209._4_4_ = fVar187 * fVar126 + fVar194;
              auVar209._8_4_ = fVar187 * fVar127 + fVar194;
              auVar209._12_4_ = fVar187 * fVar128 + fVar194;
              auVar28._8_8_ = local_1c10._8_8_;
              auVar28._0_8_ = local_1c10._0_8_;
              auVar63._8_8_ = local_1c10._24_8_;
              auVar63._0_8_ = local_1c10._16_8_;
              auVar65._8_8_ = local_1c10._40_8_;
              auVar65._0_8_ = local_1c10._32_8_;
              auVar139 = vsubps_avx(auVar130,auVar28);
              auVar263._0_4_ = local_1bb0._0_4_ * auVar139._0_4_;
              auVar263._4_4_ = local_1bb0._4_4_ * auVar139._4_4_;
              auVar263._8_4_ = local_1bb0._8_4_ * auVar139._8_4_;
              auVar263._12_4_ = local_1bb0._12_4_ * auVar139._12_4_;
              auVar139 = vsubps_avx(auVar141,auVar63);
              auVar267._0_4_ = auVar139._0_4_ * (float)local_1ba0._0_4_;
              auVar267._4_4_ = auVar139._4_4_ * (float)local_1ba0._4_4_;
              auVar267._8_4_ = auVar139._8_4_ * fStack_1b98;
              auVar267._12_4_ = auVar139._12_4_ * fStack_1b94;
              auVar139 = vsubps_avx(auVar161,auVar65);
              auVar277._0_4_ = auVar139._0_4_ * (float)local_1b90._0_4_;
              auVar277._4_4_ = auVar139._4_4_ * (float)local_1b90._4_4_;
              auVar277._8_4_ = auVar139._8_4_ * fStack_1b88;
              auVar277._12_4_ = auVar139._12_4_ * fStack_1b84;
              auVar139 = vsubps_avx(auVar178,auVar28);
              auVar179._0_4_ = local_1bb0._0_4_ * auVar139._0_4_;
              auVar179._4_4_ = local_1bb0._4_4_ * auVar139._4_4_;
              auVar179._8_4_ = local_1bb0._8_4_ * auVar139._8_4_;
              auVar179._12_4_ = local_1bb0._12_4_ * auVar139._12_4_;
              auVar139 = vsubps_avx(auVar189,auVar63);
              auVar142._0_4_ = auVar139._0_4_ * (float)local_1ba0._0_4_;
              auVar142._4_4_ = auVar139._4_4_ * (float)local_1ba0._4_4_;
              auVar142._8_4_ = auVar139._8_4_ * fStack_1b98;
              auVar142._12_4_ = auVar139._12_4_ * fStack_1b94;
              auVar139 = vsubps_avx(auVar209,auVar65);
              auVar162._0_4_ = auVar139._0_4_ * (float)local_1b90._0_4_;
              auVar162._4_4_ = auVar139._4_4_ * (float)local_1b90._4_4_;
              auVar162._8_4_ = auVar139._8_4_ * fStack_1b88;
              auVar162._12_4_ = auVar139._12_4_ * fStack_1b84;
              auVar139 = vpminsd_avx(auVar263,auVar179);
              auVar100 = vpminsd_avx(auVar267,auVar142);
              auVar139 = vpmaxsd_avx(auVar139,auVar100);
              auVar100 = vpminsd_avx(auVar277,auVar162);
              auVar139 = vpmaxsd_avx(auVar139,auVar100);
              auVar131._0_4_ = auVar139._0_4_ * 0.99999964;
              auVar131._4_4_ = auVar139._4_4_ * 0.99999964;
              auVar131._8_4_ = auVar139._8_4_ * 0.99999964;
              auVar131._12_4_ = auVar139._12_4_ * 0.99999964;
              auVar139 = vpmaxsd_avx(auVar263,auVar179);
              auVar100 = vpmaxsd_avx(auVar267,auVar142);
              auVar100 = vpminsd_avx(auVar139,auVar100);
              auVar139 = vpmaxsd_avx(auVar277,auVar162);
              auVar100 = vpminsd_avx(auVar100,auVar139);
              auVar139 = vpmaxsd_avx(auVar131,local_1b50);
              auVar163._0_4_ = auVar100._0_4_ * 1.0000004;
              auVar163._4_4_ = auVar100._4_4_ * 1.0000004;
              auVar163._8_4_ = auVar100._8_4_ * 1.0000004;
              auVar163._12_4_ = auVar100._12_4_ * 1.0000004;
              auVar100 = vpminsd_avx(auVar163,local_1b40);
              if ((uVar67 & 7) == 6) {
                auVar139 = vcmpps_avx(auVar139,auVar100,2);
                uVar68 = *(undefined4 *)(uVar71 + 0xf0 + lVar74);
                auVar164._4_4_ = uVar68;
                auVar164._0_4_ = uVar68;
                auVar164._8_4_ = uVar68;
                auVar164._12_4_ = uVar68;
                auVar100 = vcmpps_avx(auVar164,auVar113,2);
                uVar68 = *(undefined4 *)(uVar71 + 0x100 + lVar74);
                auVar180._4_4_ = uVar68;
                auVar180._0_4_ = uVar68;
                auVar180._8_4_ = uVar68;
                auVar180._12_4_ = uVar68;
                auVar113 = vcmpps_avx(auVar113,auVar180,1);
                auVar113 = vandps_avx(auVar100,auVar113);
                auVar113 = vandps_avx(auVar113,auVar139);
              }
              else {
                auVar113 = vcmpps_avx(auVar139,auVar100,2);
              }
              auVar113 = vandps_avx(auVar113,auVar87);
              auVar113 = vpslld_avx(auVar113,0x1f);
              if ((((auVar113 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar113 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar113 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar113[0xf]) {
                auVar123 = ZEXT1664(auVar101);
                root.ptr = uVar78;
              }
              else {
                auVar143._8_4_ = 0x7f800000;
                auVar143._0_8_ = 0x7f8000007f800000;
                auVar143._12_4_ = 0x7f800000;
                auVar113 = vblendvps_avx(auVar143,auVar131,auVar113);
                auVar123 = ZEXT1664(auVar113);
                if (uVar78 != 8) {
                  *puVar79 = uVar78;
                  puVar79 = puVar79 + 1;
                  *pauVar80 = auVar101;
                  pauVar80 = pauVar80 + 1;
                }
              }
              auVar101 = auVar123._0_16_;
              lVar74 = lVar74 + 4;
              uVar78 = root.ptr;
            } while (lVar74 != 0);
            if (root.ptr == 8) {
              iVar69 = 4;
              auVar87 = vpcmpeqd_avx(auVar101,auVar101);
              auVar111 = ZEXT1664(auVar87);
              local_1de0 = puVar79;
              local_1de8 = pauVar80;
              goto LAB_0030b61c;
            }
            auVar87 = vcmpps_avx(local_1b40,auVar123._0_16_,6);
            uVar68 = vmovmskps_avx(auVar87);
            auVar87 = vpcmpeqd_avx(auVar101,auVar101);
            auVar111 = ZEXT1664(auVar87);
          } while (bVar61 < (byte)POPCOUNT(uVar68));
          *puVar79 = root.ptr;
          *pauVar80 = auVar123._0_16_;
          iVar69 = 4;
          local_1de0 = puVar79 + 1;
          local_1de8 = pauVar80 + 1;
        }
        else {
          do {
            local_1d30 = auVar87;
            k = 0;
            if (uVar78 != 0) {
              for (; (uVar78 >> k & 1) == 0; k = k + 1) {
              }
            }
            auVar111 = ZEXT1664(auVar111._0_16_);
            bVar85 = occluded1(local_1d00,local_1d08,root,k,&local_1dea,local_1dd8,
                               (TravRayK<4,_true> *)&local_1c10.field_0,context);
            if (bVar85) {
              *(undefined4 *)(local_1dc0 + k * 4) = 0xffffffff;
            }
            uVar78 = uVar78 & uVar78 - 1;
            auVar87 = local_1d30;
          } while (uVar78 != 0);
          auVar87 = vpcmpeqd_avx(auVar111._0_16_,auVar111._0_16_);
          auVar113 = auVar87 & ~local_1dc0;
          iVar69 = 3;
          if ((((auVar113 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar113 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar113 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar113[0xf] < '\0') {
            auVar113._8_4_ = 0xff800000;
            auVar113._0_8_ = 0xff800000ff800000;
            auVar113._12_4_ = 0xff800000;
            auVar113 = vblendvps_avx(local_1b40,auVar113,local_1dc0);
            auVar87 = vpcmpeqd_avx(local_1b40,local_1b40);
            iVar69 = 2;
            local_1b40 = auVar113;
          }
          auVar111 = ZEXT1664(auVar87);
          auVar123 = ZEXT1664(local_1d30);
          puVar79 = local_1de0;
          pauVar80 = local_1de8;
          ray = local_1dd8;
          if (local_1db0 < uVar71) goto LAB_0030a1bf;
        }
LAB_0030b61c:
        puVar79 = local_1de0;
        pauVar80 = local_1de8;
      } while (iVar69 != 3);
LAB_0030b741:
      auVar87 = vandps_avx(local_1a70,local_1dc0);
      auVar109._8_4_ = 0xff800000;
      auVar109._0_8_ = 0xff800000ff800000;
      auVar109._12_4_ = 0xff800000;
      auVar87 = vmaskmovps_avx(auVar87,auVar109);
      *(undefined1 (*) [16])local_1da8 = auVar87;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }